

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O1

void ImGui::ShowDemoWindow(bool *p_open)

{
  _Bool *p_open_00;
  char cVar1;
  ushort uVar2;
  double dVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  bool bVar6;
  _Bool _Var7;
  _Bool _Var8;
  bool bVar9;
  bool bVar10;
  ImGuiID IVar11;
  uint uVar12;
  ImU32 IVar13;
  ImU32 IVar14;
  ImGuiMouseCursor IVar15;
  ImGuiContext_conflict1 *pIVar16;
  ImGuiViewport *pIVar17;
  ImGuiIO *pIVar18;
  void *pvVar19;
  ImDrawList *pIVar20;
  ImGuiStyle *pIVar21;
  ulong uVar22;
  long lVar23;
  int obj_i;
  uint uVar24;
  int iVar25;
  ImGuiCond cond;
  bool *pbVar26;
  int i;
  ImGuiWindowFlags flags;
  long lVar27;
  char *pcVar28;
  int iVar29;
  char *pcVar30;
  ImGui *this;
  int i_12;
  int i_2;
  undefined8 *puVar31;
  MyDocument *pMVar32;
  ulong uVar33;
  int n;
  long lVar34;
  undefined **ppuVar35;
  float fVar36;
  float fVar37;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  ImVec2 p1;
  ImVec2 gradient_size;
  char label [128];
  ImVec2 mouse_pos_in_canvas;
  float local_168;
  float fStack_164;
  ImVec2 local_158;
  ImVec2 local_150;
  ImVec2 local_148 [2];
  undefined1 local_138 [16];
  ImVec2 local_120;
  undefined1 local_118 [28];
  float local_fc;
  ImVec2 local_f8;
  ImVec2 local_f0;
  undefined1 local_e8 [8];
  ImVec2 IStack_e0;
  ImVec2 local_d8;
  ImVec2 IStack_d0;
  char *local_c8;
  char *pcStack_c0;
  char *local_b8;
  ImVec2 local_60;
  int local_54;
  bool *local_50;
  undefined1 local_48 [8];
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pIVar16 = GetCurrentContext();
  if (pIVar16 == (ImGuiContext_conflict1 *)0x0) {
    __assert_fail("ImGui::GetCurrentContext() != __null && \"Missing dear imgui context. Refer to examples app!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_demo.cpp"
                  ,0x112,"void ImGui::ShowDemoWindow(bool *)");
  }
  if ((ShowDemoWindow::show_app_main_menu_bar == true) && (bVar6 = BeginMainMenuBar(), bVar6)) {
    bVar6 = BeginMenu("File",true);
    if (bVar6) {
      ShowExampleMenuFile();
      EndMenu();
    }
    bVar6 = BeginMenu("Edit",true);
    if (bVar6) {
      MenuItem("Undo","CTRL+Z",false,true);
      MenuItem("Redo","CTRL+Y",false,false);
      Separator();
      MenuItem("Cut","CTRL+X",false,true);
      MenuItem("Copy","CTRL+C",false,true);
      MenuItem("Paste","CTRL+V",false,true);
      EndMenu();
    }
    EndMainMenuBar();
  }
  if (ShowDemoWindow::show_app_dockspace == true) {
    if (ShowExampleAppDockSpace(bool*)::opt_fullscreen == '\x01') {
      pIVar17 = GetMainViewport();
      local_e8._0_4_ = 0.0;
      local_e8._4_4_ = 0.0;
      SetNextWindowPos(&pIVar17->WorkPos,0,(ImVec2 *)local_e8);
      SetNextWindowSize(&pIVar17->WorkSize,0);
      SetNextWindowViewport(pIVar17->ID);
      PushStyleVar(3,0.0);
      PushStyleVar(4,0.0);
      uVar12 = 0x282427;
    }
    else {
      ShowExampleAppDockSpace(bool*)::dockspace_flags =
           ShowExampleAppDockSpace(bool*)::dockspace_flags & 0xfffffff7;
      uVar12 = 0x200400;
    }
    uVar24 = ShowExampleAppDockSpace(bool*)::dockspace_flags & 8;
    if (ShowExampleAppDockSpace(bool*)::opt_padding == '\0') {
      local_e8._0_4_ = 0.0;
      local_e8._4_4_ = 0.0;
      PushStyleVar(2,(ImVec2 *)local_e8);
    }
    Begin("DockSpace Demo",&ShowDemoWindow::show_app_dockspace,uVar24 << 4 | uVar12);
    if (ShowExampleAppDockSpace(bool*)::opt_padding == '\0') {
      PopStyleVar(1);
    }
    if (ShowExampleAppDockSpace(bool*)::opt_fullscreen == '\x01') {
      PopStyleVar(2);
    }
    pIVar18 = GetIO();
    if ((pIVar18->ConfigFlags & 0x40) == 0) {
      ShowDockingDisabledMessage();
    }
    else {
      IVar11 = GetID("MyDockSpace");
      local_e8._0_4_ = 0.0;
      local_e8._4_4_ = 0.0;
      DockSpace(IVar11,(ImVec2 *)local_e8,ShowExampleAppDockSpace(bool*)::dockspace_flags,
                (ImGuiWindowClass *)0x0);
    }
    bVar6 = BeginMenuBar();
    if (bVar6) {
      bVar6 = BeginMenu("Options",true);
      if (bVar6) {
        MenuItem("Fullscreen",(char *)0x0,(bool *)&ShowExampleAppDockSpace(bool*)::opt_fullscreen,
                 true);
        MenuItem("Padding",(char *)0x0,(bool *)&ShowExampleAppDockSpace(bool*)::opt_padding,true);
        Separator();
        bVar6 = MenuItem("Flag: NoSplit","",
                         SUB41((ShowExampleAppDockSpace(bool*)::dockspace_flags & 0x10) >> 4,0),true
                        );
        if (bVar6) {
          ShowExampleAppDockSpace(bool*)::dockspace_flags =
               ShowExampleAppDockSpace(bool*)::dockspace_flags ^ 0x10;
        }
        bVar6 = MenuItem("Flag: NoResize","",
                         SUB41((ShowExampleAppDockSpace(bool*)::dockspace_flags & 0x20) >> 5,0),true
                        );
        if (bVar6) {
          ShowExampleAppDockSpace(bool*)::dockspace_flags =
               ShowExampleAppDockSpace(bool*)::dockspace_flags ^ 0x20;
        }
        bVar6 = MenuItem("Flag: NoDockingInCentralNode","",
                         SUB41((ShowExampleAppDockSpace(bool*)::dockspace_flags & 4) >> 2,0),true);
        if (bVar6) {
          ShowExampleAppDockSpace(bool*)::dockspace_flags =
               ShowExampleAppDockSpace(bool*)::dockspace_flags ^ 4;
        }
        bVar6 = MenuItem("Flag: AutoHideTabBar","",
                         SUB41((ShowExampleAppDockSpace(bool*)::dockspace_flags & 0x40) >> 6,0),true
                        );
        if (bVar6) {
          ShowExampleAppDockSpace(bool*)::dockspace_flags =
               ShowExampleAppDockSpace(bool*)::dockspace_flags ^ 0x40;
        }
        bVar6 = MenuItem("Flag: PassthruCentralNode","",
                         SUB41((ShowExampleAppDockSpace(bool*)::dockspace_flags & 8) >> 3,0),
                         (bool)ShowExampleAppDockSpace(bool*)::opt_fullscreen);
        if (bVar6) {
          ShowExampleAppDockSpace(bool*)::dockspace_flags =
               ShowExampleAppDockSpace(bool*)::dockspace_flags ^ 8;
        }
        Separator();
        bVar6 = MenuItem("Close",(char *)0x0,false,true);
        if (bVar6) {
          ShowDemoWindow::show_app_dockspace = false;
        }
        EndMenu();
      }
      HelpMarker(
                "When docking is enabled, you can ALWAYS dock MOST window into another! Try it now!\n- Drag from window title bar or their tab to dock/undock.\n- Drag from window menu button (upper-left button) to undock an entire node (all windows).\n- Hold SHIFT to disable docking (if io.ConfigDockingWithShift == false, default)\n- Hold SHIFT to enable docking (if io.ConfigDockingWithShift == true)\nThis demo app has nothing to do with enabling docking!\n\nThis demo app only demonstrate the use of ImGui::DockSpace() which allows you to manually create a docking node _within_ another window.\n\nRead comments in ShowExampleAppDockSpace() for more details."
                );
      EndMenuBar();
    }
    End();
  }
  if (ShowDemoWindow::show_app_documents != true) goto LAB_001ef21e;
  if ((ShowExampleAppDocuments(bool*)::app == '\0') &&
     (iVar25 = __cxa_guard_acquire(&ShowExampleAppDocuments(bool*)::app), iVar25 != 0)) {
    ExampleAppDocuments::ExampleAppDocuments
              ((ExampleAppDocuments *)&ShowExampleAppDocuments(bool*)::app);
    __cxa_atexit(ExampleAppDocuments::~ExampleAppDocuments,&ShowExampleAppDocuments(bool*)::app,
                 &__dso_handle);
    __cxa_guard_release(&ShowExampleAppDocuments(bool*)::app);
  }
  _Var7 = Begin("Example: Documents",&ShowDemoWindow::show_app_documents,0x400);
  if ((_Var7) || (ShowExampleAppDocuments(bool*)::opt_target == 2)) {
    bVar6 = BeginMenuBar();
    if (bVar6) {
      bVar6 = BeginMenu("File",true);
      if (bVar6) {
        if ((long)ShowExampleAppDocuments(bool*)::app < 1) {
          iVar25 = 0;
        }
        else {
          lVar27 = 0;
          iVar25 = 0;
          do {
            iVar25 = iVar25 + (uint)*(byte *)(DAT_0030ec48 + 8 + lVar27);
            lVar27 = lVar27 + 0x20;
          } while ((long)ShowExampleAppDocuments(bool*)::app << 5 != lVar27);
        }
        bVar6 = BeginMenu("Open",iVar25 < ShowExampleAppDocuments(bool*)::app);
        if (bVar6) {
          if (0 < ShowExampleAppDocuments(bool*)::app) {
            lVar27 = 8;
            lVar34 = 0;
            do {
              lVar23 = DAT_0030ec48;
              if ((*(char *)(DAT_0030ec48 + lVar27) == '\0') &&
                 (bVar6 = MenuItem(*(char **)(DAT_0030ec48 + -8 + lVar27),(char *)0x0,false,true),
                 bVar6)) {
                *(undefined1 *)(lVar23 + lVar27) = 1;
              }
              lVar34 = lVar34 + 1;
              lVar27 = lVar27 + 0x20;
            } while (lVar34 < ShowExampleAppDocuments(bool*)::app);
          }
          EndMenu();
        }
        bVar6 = MenuItem("Close All Documents",(char *)0x0,false,iVar25 != 0);
        lVar27 = DAT_0030ec48;
        if ((bVar6) && (lVar34 = (long)ShowExampleAppDocuments(bool*)::app, 0 < lVar34)) {
          lVar23 = 0;
          do {
            *(undefined1 *)(lVar27 + 0xb + lVar23) = 1;
            lVar23 = lVar23 + 0x20;
          } while (lVar34 * 0x20 != lVar23);
        }
        MenuItem("Exit","Alt+F4",false,true);
        EndMenu();
      }
      EndMenuBar();
    }
    local_50 = p_open;
    if (0 < ShowExampleAppDocuments(bool*)::app) {
      lVar34 = 8;
      lVar27 = 0;
      do {
        lVar23 = DAT_0030ec48;
        if (lVar27 != 0) {
          SameLine(0.0,-1.0);
        }
        puVar31 = (undefined8 *)(lVar34 + lVar23 + -8);
        PushID(puVar31);
        bVar6 = Checkbox((char *)*puVar31,(bool *)(lVar34 + lVar23));
        if ((bVar6) && (*(bool *)(lVar34 + lVar23) == false)) {
          *(undefined1 *)(lVar23 + lVar34) = 0;
          *(undefined1 *)(lVar23 + 2 + lVar34) = 0;
        }
        PopID();
        lVar27 = lVar27 + 1;
        lVar34 = lVar34 + 0x20;
      } while (lVar27 < ShowExampleAppDocuments(bool*)::app);
    }
    fVar36 = GetFontSize();
    PushItemWidth(fVar36 * 12.0);
    pcVar30 = "Output";
    Combo("Output",&ShowExampleAppDocuments(bool*)::opt_target,"None",-1);
    PopItemWidth();
    if (ShowExampleAppDocuments(bool*)::opt_target == 1) {
      SameLine(0.0,-1.0);
      pcVar30 = "Reorderable Tabs";
      Checkbox("Reorderable Tabs",(bool *)&ShowExampleAppDocuments(bool*)::opt_reorderable);
    }
    cond = 4;
    if (ShowExampleAppDocuments(bool*)::opt_target == 2) {
      SameLine(0.0,-1.0);
      local_e8._0_4_ = 0.0;
      local_e8._4_4_ = 0.0;
      pcVar30 = "Redock all";
      bVar6 = Button("Redock all",(ImVec2 *)local_e8);
      cond = (uint)!bVar6 + (uint)!bVar6 * 2 + 1;
    }
    Separator();
    if (ShowExampleAppDocuments(bool*)::opt_target == 2) {
      pIVar18 = GetIO();
      if ((pIVar18->ConfigFlags & 0x40) == 0) {
        ShowDockingDisabledMessage();
      }
      else {
        NotifyOfDocumentsClosedElsewhere((ExampleAppDocuments *)pcVar30);
        IVar11 = GetID("MyDockSpace");
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        DockSpace(IVar11,(ImVec2 *)local_e8,0,(ImGuiWindowClass *)0x0);
        if (0 < ShowExampleAppDocuments(bool*)::app) {
          lVar34 = 8;
          lVar27 = 0;
          do {
            lVar23 = DAT_0030ec48;
            if (*(char *)(DAT_0030ec48 + lVar34) == '\x01') {
              p_open_00 = (_Bool *)(DAT_0030ec48 + lVar34);
              SetNextWindowDockID(IVar11,cond);
              _Var8 = Begin(*(char **)(lVar23 + -8 + lVar34),p_open_00,
                            (uint)*(byte *)(lVar23 + 2 + lVar34) << 0x14);
              if ((*(char *)(lVar23 + lVar34) == '\0') && (*(char *)(lVar23 + 2 + lVar34) == '\x01')
                 ) {
                *(undefined1 *)(lVar23 + lVar34) = 1;
                *(undefined1 *)(lVar23 + 3 + lVar34) = 1;
              }
              pMVar32 = (MyDocument *)(lVar23 + lVar34 + -8);
              MyDocument::DisplayContextMenu(pMVar32);
              if (_Var8) {
                MyDocument::DisplayContents(pMVar32);
              }
              End();
            }
            lVar27 = lVar27 + 1;
            lVar34 = lVar34 + 0x20;
          } while (lVar27 < ShowExampleAppDocuments(bool*)::app);
        }
      }
    }
    else if (ShowExampleAppDocuments(bool*)::opt_target == 1) {
      pcVar30 = "##tabs";
      bVar6 = BeginTabBar("##tabs",ShowExampleAppDocuments(bool*)::opt_reorderable | 0x40);
      if (bVar6) {
        if (ShowExampleAppDocuments(bool*)::opt_reorderable == 1) {
          NotifyOfDocumentsClosedElsewhere((ExampleAppDocuments *)pcVar30);
        }
        if (0 < ShowExampleAppDocuments(bool*)::app) {
          lVar34 = 8;
          lVar27 = 0;
          do {
            lVar23 = DAT_0030ec48;
            if (*(char *)(DAT_0030ec48 + lVar34) == '\x01') {
              bVar6 = BeginTabItem(*(char **)(DAT_0030ec48 + -8 + lVar34),
                                   (bool *)(DAT_0030ec48 + lVar34),
                                   (uint)*(byte *)(DAT_0030ec48 + 2 + lVar34));
              if ((*(char *)(lVar23 + lVar34) == '\0') && (*(char *)(lVar23 + 2 + lVar34) == '\x01')
                 ) {
                *(undefined1 *)(lVar23 + lVar34) = 1;
                *(undefined1 *)(lVar23 + 3 + lVar34) = 1;
              }
              pMVar32 = (MyDocument *)(lVar23 + lVar34 + -8);
              MyDocument::DisplayContextMenu(pMVar32);
              if (bVar6) {
                MyDocument::DisplayContents(pMVar32);
                EndTabItem();
              }
            }
            lVar27 = lVar27 + 1;
            lVar34 = lVar34 + 0x20;
          } while (lVar27 < ShowExampleAppDocuments(bool*)::app);
        }
        EndTabBar();
      }
    }
    p_open = local_50;
    if (_Var7) {
      if (ShowExampleAppDocuments(bool*)::close_queue == '\0') {
        ShowDemoWindow();
      }
      if ((ShowExampleAppDocuments(bool*)::close_queue == 0) &&
         (0 < ShowExampleAppDocuments(bool*)::app)) {
        lVar27 = 0;
        lVar34 = 0;
        do {
          lVar23 = DAT_0030ec48;
          if (*(char *)(DAT_0030ec48 + 0xb + lVar27) == '\x01') {
            *(undefined1 *)(DAT_0030ec48 + 0xb + lVar27) = 0;
            if (ShowExampleAppDocuments(bool*)::close_queue == DAT_0030ec5c) {
              if (DAT_0030ec5c == 0) {
                iVar25 = 8;
              }
              else {
                iVar25 = DAT_0030ec5c / 2 + DAT_0030ec5c;
              }
              iVar29 = ShowExampleAppDocuments(bool*)::close_queue + 1;
              if (ShowExampleAppDocuments(bool*)::close_queue + 1 < iVar25) {
                iVar29 = iVar25;
              }
              if (DAT_0030ec5c < iVar29) {
                pvVar19 = MemAlloc((long)iVar29 << 3);
                if (DAT_0030ec60 != (void *)0x0) {
                  memcpy(pvVar19,DAT_0030ec60,(long)ShowExampleAppDocuments(bool*)::close_queue << 3
                        );
                  MemFree(DAT_0030ec60);
                }
                _close_queue = CONCAT44(iVar29,ShowExampleAppDocuments(bool*)::close_queue);
                DAT_0030ec60 = pvVar19;
              }
            }
            *(long *)((long)DAT_0030ec60 + (long)ShowExampleAppDocuments(bool*)::close_queue * 8) =
                 lVar23 + lVar27;
            ShowExampleAppDocuments(bool*)::close_queue =
                 ShowExampleAppDocuments(bool*)::close_queue + 1;
          }
          lVar34 = lVar34 + 1;
          lVar27 = lVar27 + 0x20;
        } while (lVar34 < ShowExampleAppDocuments(bool*)::app);
      }
      pvVar19 = DAT_0030ec60;
      uVar33 = _close_queue & 0xffffffff;
      if (uVar33 != 0) {
        if (0 < ShowExampleAppDocuments(bool*)::close_queue) {
          uVar22 = 0;
          iVar25 = 0;
          do {
            iVar25 = iVar25 + (uint)*(byte *)(*(long *)((long)DAT_0030ec60 + uVar22 * 8) + 10);
            uVar22 = uVar22 + 1;
          } while (uVar33 != uVar22);
          if (iVar25 != 0) {
            _Var7 = IsPopupOpen("Save?",0);
            if (!_Var7) {
              OpenPopup("Save?",0);
            }
            _Var7 = BeginPopupModal("Save?",(_Bool *)0x0,0x40);
            if (_Var7) {
              Text("Save change to the following items?");
              fVar36 = GetTextLineHeightWithSpacing();
              IVar11 = GetID("frame");
              local_e8._4_4_ = fVar36 * 6.25;
              local_e8._0_4_ = -1.1754944e-38;
              _Var7 = BeginChildFrame(IVar11,(ImVec2 *)local_e8,0);
              if (_Var7) {
                if (0 < ShowExampleAppDocuments(bool*)::close_queue) {
                  lVar27 = 0;
                  do {
                    puVar31 = *(undefined8 **)((long)DAT_0030ec60 + lVar27 * 8);
                    if (*(char *)((long)puVar31 + 10) == '\x01') {
                      Text("%s",*puVar31);
                    }
                    lVar27 = lVar27 + 1;
                  } while (lVar27 < ShowExampleAppDocuments(bool*)::close_queue);
                }
                EndChildFrame();
              }
              fVar36 = GetFontSize();
              local_e8._4_4_ = 0;
              local_e8._0_4_ = fVar36 * 7.0;
              bVar6 = Button("Yes",(ImVec2 *)local_e8);
              pvVar19 = DAT_0030ec60;
              if (bVar6) {
                lVar27 = (long)ShowExampleAppDocuments(bool*)::close_queue;
                if (0 < lVar27) {
                  lVar34 = 0;
                  do {
                    lVar23 = *(long *)((long)pvVar19 + lVar34 * 8);
                    if (*(char *)(lVar23 + 10) == '\x01') {
                      *(undefined1 *)(lVar23 + 10) = 0;
                    }
                    *(undefined1 *)(lVar23 + 8) = 0;
                    *(undefined1 *)(lVar23 + 10) = 0;
                    lVar34 = lVar34 + 1;
                  } while (lVar27 != lVar34);
                }
                if (DAT_0030ec60 != (void *)0x0) {
                  _close_queue = 0;
                  MemFree(DAT_0030ec60);
                  DAT_0030ec60 = (void *)0x0;
                }
                CloseCurrentPopup();
              }
              SameLine(0.0,-1.0);
              bVar6 = Button("No",(ImVec2 *)local_e8);
              pvVar19 = DAT_0030ec60;
              if (bVar6) {
                lVar27 = (long)ShowExampleAppDocuments(bool*)::close_queue;
                if (0 < lVar27) {
                  lVar34 = 0;
                  do {
                    lVar23 = *(long *)((long)pvVar19 + lVar34 * 8);
                    *(undefined1 *)(lVar23 + 8) = 0;
                    *(undefined1 *)(lVar23 + 10) = 0;
                    lVar34 = lVar34 + 1;
                  } while (lVar27 != lVar34);
                }
                if (DAT_0030ec60 != (void *)0x0) {
                  _close_queue = 0;
                  MemFree(DAT_0030ec60);
                  DAT_0030ec60 = (void *)0x0;
                }
                CloseCurrentPopup();
              }
              SameLine(0.0,-1.0);
              bVar6 = Button("Cancel",(ImVec2 *)local_e8);
              if (bVar6) {
                if (DAT_0030ec60 != (void *)0x0) {
                  _close_queue = 0;
                  MemFree(DAT_0030ec60);
                  DAT_0030ec60 = (void *)0x0;
                }
                CloseCurrentPopup();
              }
              EndPopup();
            }
            goto LAB_001ef219;
          }
          if (0 < ShowExampleAppDocuments(bool*)::close_queue) {
            uVar22 = 0;
            do {
              lVar27 = *(long *)((long)pvVar19 + uVar22 * 8);
              *(undefined1 *)(lVar27 + 8) = 0;
              *(undefined1 *)(lVar27 + 10) = 0;
              uVar22 = uVar22 + 1;
            } while (uVar33 != uVar22);
          }
        }
        if (DAT_0030ec60 != (void *)0x0) {
          _close_queue = 0;
          MemFree(DAT_0030ec60);
          DAT_0030ec60 = (void *)0x0;
        }
      }
    }
  }
LAB_001ef219:
  End();
LAB_001ef21e:
  if (ShowDemoWindow::show_app_console == true) {
    if ((ShowExampleAppConsole(bool*)::console == '\0') &&
       (iVar25 = __cxa_guard_acquire(&ShowExampleAppConsole(bool*)::console), iVar25 != 0)) {
      ExampleAppConsole::ExampleAppConsole
                ((ExampleAppConsole *)ShowExampleAppConsole(bool*)::console);
      __cxa_atexit(ExampleAppConsole::~ExampleAppConsole,ShowExampleAppConsole(bool*)::console,
                   &__dso_handle);
      __cxa_guard_release(&ShowExampleAppConsole(bool*)::console);
    }
    ExampleAppConsole::Draw
              ((ExampleAppConsole *)ShowExampleAppConsole(bool*)::console,"Example: Console",
               &ShowDemoWindow::show_app_console);
  }
  if (ShowDemoWindow::show_app_log == true) {
    local_50 = p_open;
    if ((ShowExampleAppLog(bool*)::log == '\0') &&
       (iVar25 = __cxa_guard_acquire(&ShowExampleAppLog(bool*)::log), iVar25 != 0)) {
      ExampleAppLog::ExampleAppLog((ExampleAppLog *)ShowExampleAppLog(bool*)::log);
      __cxa_atexit(ExampleAppLog::~ExampleAppLog,ShowExampleAppLog(bool*)::log,&__dso_handle);
      __cxa_guard_release(&ShowExampleAppLog(bool*)::log);
    }
    local_e8._0_4_ = 500.0;
    local_e8._4_4_ = 400.0;
    SetNextWindowSize((ImVec2 *)local_e8,4);
    Begin("Example: Log",&ShowDemoWindow::show_app_log,0);
    bVar6 = SmallButton("[Debug] Add 5 entries");
    if (bVar6) {
      iVar25 = 5;
      do {
        uVar12 = GetFrameCount();
        dVar3 = GetTime();
        ExampleAppLog::AddLog
                  ((ExampleAppLog *)ShowExampleAppLog(bool*)::log,
                   "[%05d] [%s] Hello, current time is %.1f, here\'s a word: \'%s\'\n",
                   SUB84(dVar3,0),(ulong)uVar12);
        ShowExampleAppLog(bool*)::counter = ShowExampleAppLog(bool*)::counter + 1;
        iVar25 = iVar25 + -1;
      } while (iVar25 != 0);
    }
    End();
    ExampleAppLog::Draw((ExampleAppLog *)ShowExampleAppLog(bool*)::log,"Example: Log",
                        &ShowDemoWindow::show_app_log);
    p_open = local_50;
  }
  if (ShowDemoWindow::show_app_layout == true) {
    local_e8._0_4_ = 500.0;
    local_e8._4_4_ = 440.0;
    SetNextWindowSize((ImVec2 *)local_e8,4);
    _Var7 = Begin("Example: Simple layout",&ShowDemoWindow::show_app_layout,0x400);
    if (_Var7) {
      bVar6 = BeginMenuBar();
      if (bVar6) {
        bVar6 = BeginMenu("File",true);
        if (bVar6) {
          bVar6 = MenuItem("Close",(char *)0x0,false,true);
          if (bVar6) {
            ShowDemoWindow::show_app_layout = false;
          }
          EndMenu();
        }
        EndMenuBar();
      }
      local_e8._0_4_ = 150.0;
      local_e8._4_4_ = 0.0;
      BeginChild("left pane",(ImVec2 *)local_e8,true,0);
      uVar33 = 0;
      do {
        iVar25 = (int)uVar33;
        sprintf((char *)local_e8,"MyObject %d",uVar33);
        local_158.x = 0.0;
        local_158.y = 0.0;
        bVar6 = Selectable((char *)local_e8,iVar25 == ShowExampleAppLayout(bool*)::selected,0,
                           &local_158);
        if (bVar6) {
          ShowExampleAppLayout(bool*)::selected = iVar25;
        }
        uVar33 = (ulong)(iVar25 + 1U);
      } while (iVar25 + 1U != 100);
      EndChild();
      SameLine(0.0,-1.0);
      BeginGroup();
      fVar36 = GetFrameHeightWithSpacing();
      local_e8 = (undefined1  [8])((ulong)(uint)fVar36 << 0x20 ^ 0x8000000000000000);
      BeginChild("item view",(ImVec2 *)local_e8,false,0);
      Text("MyObject: %d");
      Separator();
      bVar6 = BeginTabBar("##Tabs",0);
      if (bVar6) {
        bVar6 = BeginTabItem("Description",(bool *)0x0,0);
        if (bVar6) {
          TextWrapped(
                     "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. "
                     );
          EndTabItem();
        }
        bVar6 = BeginTabItem("Details",(bool *)0x0,0);
        if (bVar6) {
          Text("ID: 0123456789");
          EndTabItem();
        }
        EndTabBar();
      }
      EndChild();
      local_e8._0_4_ = 0.0;
      local_e8._4_4_ = 0.0;
      Button("Revert",(ImVec2 *)local_e8);
      SameLine(0.0,-1.0);
      local_e8._0_4_ = 0.0;
      local_e8._4_4_ = 0.0;
      Button("Save",(ImVec2 *)local_e8);
      EndGroup();
    }
    End();
  }
  if (ShowDemoWindow::show_app_property_editor == true) {
    local_e8._0_4_ = 430.0;
    local_e8._4_4_ = 450.0;
    SetNextWindowSize((ImVec2 *)local_e8,4);
    _Var7 = Begin("Example: Property editor",&ShowDemoWindow::show_app_property_editor,0);
    if (_Var7) {
      HelpMarker(
                "This example shows how you may implement a property editor using two columns.\nAll objects/fields data are dummies here.\nRemember that in many simple cases, you can use ImGui::SameLine(xxx) to position\nyour cursor horizontally instead of using the Columns() API."
                );
      local_e8._0_4_ = 2.0;
      local_e8._4_4_ = 2.0;
      PushStyleVar(0xb,(ImVec2 *)local_e8);
      local_e8._0_4_ = 0.0;
      local_e8._4_4_ = 0.0;
      bVar6 = BeginTable("split",2,0x501,(ImVec2 *)local_e8,0.0);
      if (bVar6) {
        iVar25 = 0;
        do {
          ShowPlaceholderObject("Object",iVar25);
          iVar25 = iVar25 + 1;
        } while (iVar25 != 4);
        EndTable();
      }
      PopStyleVar(1);
    }
    End();
  }
  if (ShowDemoWindow::show_app_long_text == true) {
    local_e8._0_4_ = 520.0;
    local_e8._4_4_ = 600.0;
    SetNextWindowSize((ImVec2 *)local_e8,4);
    _Var7 = Begin("Example: Long text display",&ShowDemoWindow::show_app_long_text,0);
    if (_Var7) {
      if (ShowExampleAppLongText(bool*)::log == '\0') {
        ShowDemoWindow();
      }
      Text("Printing unusually long amount of text.");
      Combo("Test type",&ShowExampleAppLongText(bool*)::test_type,"Single call to TextUnformatted()"
            ,-1);
      uVar33 = (ulong)(ShowExampleAppLongText(bool*)::log - 1);
      if (ShowExampleAppLongText(bool*)::log == 0) {
        uVar33 = 0;
      }
      Text("Buffer contents: %d lines, %d bytes",(ulong)ShowExampleAppLongText(bool*)::lines,uVar33)
      ;
      local_e8._0_4_ = 0.0;
      local_e8._4_4_ = 0.0;
      bVar6 = Button("Clear",(ImVec2 *)local_e8);
      if (bVar6) {
        if (DAT_0030ebd0 != (char *)0x0) {
          _log = 0;
          MemFree(DAT_0030ebd0);
          DAT_0030ebd0 = (char *)0x0;
        }
        ShowExampleAppLongText(bool*)::lines = 0;
      }
      SameLine(0.0,-1.0);
      local_e8._0_4_ = 0.0;
      local_e8._4_4_ = 0.0;
      bVar6 = Button("Add 1000 lines",(ImVec2 *)local_e8);
      if (bVar6) {
        iVar25 = 0;
        do {
          ImGuiTextBuffer::appendf
                    ((ImGuiTextBuffer *)&ShowExampleAppLongText(bool*)::log,
                     "%i The quick brown fox jumps over the lazy dog\n",
                     (ulong)(ShowExampleAppLongText(bool*)::lines + iVar25));
          iVar25 = iVar25 + 1;
        } while (iVar25 != 1000);
        ShowExampleAppLongText(bool*)::lines = ShowExampleAppLongText(bool*)::lines + 1000;
      }
      local_e8._0_4_ = 0.0;
      local_e8._4_4_ = 0.0;
      BeginChild("Log",(ImVec2 *)local_e8,false,0);
      if (ShowExampleAppLongText(bool*)::test_type == 2) {
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        PushStyleVar(0xe,(ImVec2 *)local_e8);
        if (0 < (int)ShowExampleAppLongText(bool*)::lines) {
          iVar25 = 0;
          do {
            Text("%i The quick brown fox jumps over the lazy dog");
            iVar25 = iVar25 + 1;
          } while (iVar25 < (int)ShowExampleAppLongText(bool*)::lines);
        }
        PopStyleVar(1);
      }
      else if (ShowExampleAppLongText(bool*)::test_type == 1) {
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        PushStyleVar(0xe,(ImVec2 *)local_e8);
        ImGuiListClipper::ImGuiListClipper((ImGuiListClipper *)local_e8);
        ImGuiListClipper::Begin
                  ((ImGuiListClipper *)local_e8,ShowExampleAppLongText(bool*)::lines,-1.0);
        while (_Var7 = ImGuiListClipper::Step((ImGuiListClipper *)local_e8), _Var7) {
          for (fVar36 = (float)local_e8._0_4_; (int)fVar36 < (int)local_e8._4_4_;
              fVar36 = (float)((int)fVar36 + 1)) {
            Text("%i The quick brown fox jumps over the lazy dog");
          }
        }
        PopStyleVar(1);
        ImGuiListClipper::~ImGuiListClipper((ImGuiListClipper *)local_e8);
      }
      else if (ShowExampleAppLongText(bool*)::test_type == 0) {
        pcVar28 = ImGuiTextBuffer::EmptyString;
        pcVar30 = ImGuiTextBuffer::EmptyString;
        if ((DAT_0030ebd0 != (char *)0x0) &&
           (pcVar30 = DAT_0030ebd0, ShowExampleAppLongText(bool*)::log < 1)) {
          __assert_fail("Size > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                        ,0x70e,"const T &ImVector<char>::front() const [T = char]");
        }
        if (DAT_0030ebd0 != (char *)0x0) {
          if ((long)ShowExampleAppLongText(bool*)::log < 1) {
            __assert_fail("Size > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                          ,0x710,"const T &ImVector<char>::back() const [T = char]");
          }
          pcVar28 = DAT_0030ebd0 + (long)ShowExampleAppLongText(bool*)::log + -1;
        }
        TextUnformatted(pcVar30,pcVar28);
      }
      EndChild();
    }
    End();
  }
  if (ShowDemoWindow::show_app_auto_resize == true) {
    _Var7 = Begin("Example: Auto-resizing window",&ShowDemoWindow::show_app_auto_resize,0x40);
    if (_Var7) {
      TextUnformatted("Window will resize every-frame to the size of its content.\nNote that you probably don\'t want to query the window size to\noutput your content because that would create a feedback loop."
                      ,(char *)0x0);
      SliderInt("Number of lines",&ShowExampleAppAutoResize(bool*)::lines,1,0x14,"%d",0);
      if (0 < ShowExampleAppAutoResize(bool*)::lines) {
        uVar33 = 0;
        iVar25 = 0;
        do {
          Text("%*sThis is line %d",uVar33,"");
          iVar25 = iVar25 + 1;
          uVar33 = (ulong)((int)uVar33 + 4);
        } while (iVar25 < ShowExampleAppAutoResize(bool*)::lines);
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_constrained_resize == true) {
    local_b8 = "Custom: Fixed Steps (100)";
    local_c8 = "Height 400-500";
    pcStack_c0 = "Custom: Always Square";
    local_d8 = (ImVec2)0x29089c;
    IStack_d0 = (ImVec2)0x2908b6;
    local_e8 = (undefined1  [8])0x290870;
    IStack_e0 = (ImVec2)0x290885;
    if (ShowExampleAppConstrainedResize(bool*)::type == 0) {
      local_158.x = -1.0;
      local_158.y = 0.0;
      local_120.x = -1.0;
      local_120.y = 3.4028235e+38;
      SetNextWindowSizeConstraints(&local_158,&local_120,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 1) {
      local_158.x = 0.0;
      local_158.y = -1.0;
      local_120.x = 3.4028235e+38;
      local_120.y = -1.0;
      SetNextWindowSizeConstraints(&local_158,&local_120,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 2) {
      local_158.x = 100.0;
      local_158.y = 100.0;
      local_120.x = 3.4028235e+38;
      local_120.y = 3.4028235e+38;
      SetNextWindowSizeConstraints(&local_158,&local_120,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 3) {
      local_158.x = 400.0;
      local_158.y = -1.0;
      local_120.x = 500.0;
      local_120.y = -1.0;
      SetNextWindowSizeConstraints(&local_158,&local_120,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 4) {
      local_158.x = -1.0;
      local_158.y = 400.0;
      local_120.x = -1.0;
      local_120.y = 500.0;
      SetNextWindowSizeConstraints(&local_158,&local_120,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 5) {
      local_158.x = 0.0;
      local_158.y = 0.0;
      local_120.x = 3.4028235e+38;
      local_120.y = 3.4028235e+38;
      SetNextWindowSizeConstraints
                (&local_158,&local_120,ShowExampleAppConstrainedResize::CustomConstraints::Square,
                 (void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 6) {
      local_158.x = 0.0;
      local_158.y = 0.0;
      local_120.x = 3.4028235e+38;
      local_120.y = 3.4028235e+38;
      SetNextWindowSizeConstraints
                (&local_158,&local_120,ShowExampleAppConstrainedResize::CustomConstraints::Step,
                 (void *)0x64);
    }
    _Var7 = Begin("Example: Constrained Resize",&ShowDemoWindow::show_app_constrained_resize,
                  (uint)ShowExampleAppConstrainedResize(bool*)::auto_resize << 6);
    if (_Var7) {
      _Var7 = IsWindowDocked();
      if (_Var7) {
        Text("Warning: Sizing Constraints won\'t work if the window is docked!");
      }
      local_158.x = 0.0;
      local_158.y = 0.0;
      bVar6 = Button("200x200",&local_158);
      if (bVar6) {
        local_158.x = 200.0;
        local_158.y = 200.0;
        SetWindowSize(&local_158,0);
      }
      SameLine(0.0,-1.0);
      local_158.x = 0.0;
      local_158.y = 0.0;
      bVar6 = Button("500x500",&local_158);
      if (bVar6) {
        local_158.x = 500.0;
        local_158.y = 500.0;
        SetWindowSize(&local_158,0);
      }
      SameLine(0.0,-1.0);
      local_158.x = 0.0;
      local_158.y = 0.0;
      bVar6 = Button("800x200",&local_158);
      if (bVar6) {
        local_158.x = 800.0;
        local_158.y = 200.0;
        SetWindowSize(&local_158,0);
      }
      SetNextItemWidth(200.0);
      Combo("Constraint",&ShowExampleAppConstrainedResize(bool*)::type,(char **)local_e8,7,-1);
      SetNextItemWidth(200.0);
      DragInt("Lines",&ShowExampleAppConstrainedResize(bool*)::display_lines,0.2,1,100,"%d",0);
      Checkbox("Auto-resize",(bool *)&ShowExampleAppConstrainedResize(bool*)::auto_resize);
      if (0 < ShowExampleAppConstrainedResize(bool*)::display_lines) {
        uVar33 = 0;
        iVar25 = 0;
        do {
          Text("%*sHello, sailor! Making this line long enough for the example.",uVar33,"");
          iVar25 = iVar25 + 1;
          uVar33 = (ulong)((int)uVar33 + 4);
        } while (iVar25 < ShowExampleAppConstrainedResize(bool*)::display_lines);
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_simple_overlay == true) {
    pIVar18 = GetIO();
    if (ShowExampleAppSimpleOverlay(bool*)::corner == 0xffffffff) {
      flags = 0x2c116b;
    }
    else {
      pIVar17 = GetMainViewport();
      local_e8._0_4_ = (pIVar17->WorkPos).x;
      local_e8._4_4_ = (pIVar17->WorkPos).y;
      bVar6 = (ShowExampleAppSimpleOverlay(bool*)::corner & 1) == 0;
      if (bVar6) {
        local_e8._0_4_ = (float)local_e8._0_4_ + 10.0;
      }
      else {
        local_e8._0_4_ = (pIVar17->WorkSize).x + (float)local_e8._0_4_ + -10.0;
      }
      local_158.y = 0.0;
      local_158.x = 0.0;
      if (!bVar6) {
        local_158.x = 1.0;
      }
      bVar6 = (ShowExampleAppSimpleOverlay(bool*)::corner & 2) == 0;
      if (bVar6) {
        local_e8._4_4_ = (float)local_e8._4_4_ + 10.0;
      }
      else {
        local_e8._4_4_ = (pIVar17->WorkSize).y + (float)local_e8._4_4_ + -10.0;
      }
      if (!bVar6) {
        local_158.y = 1.0;
      }
      SetNextWindowPos((ImVec2 *)local_e8,1,&local_158);
      SetNextWindowViewport(pIVar17->ID);
      flags = 0x2c116f;
    }
    SetNextWindowBgAlpha(0.35);
    _Var7 = Begin("Example: Simple overlay",&ShowDemoWindow::show_app_simple_overlay,flags);
    if (_Var7) {
      Text("Simple overlay\nin the corner of the screen.\n(right-click to change position)");
      Separator();
      _Var7 = IsMousePosValid((ImVec2 *)0x0);
      if (_Var7) {
        Text("Mouse Position: (%.1f,%.1f)",SUB84((double)(pIVar18->MousePos).x,0),
             SUB84((double)(pIVar18->MousePos).y,0));
      }
      else {
        Text("Mouse Position: <invalid>");
      }
      _Var7 = BeginPopupContextWindow((char *)0x0,1);
      if (_Var7) {
        bVar6 = MenuItem("Custom",(char *)0x0,
                         ShowExampleAppSimpleOverlay(bool*)::corner == 0xffffffff,true);
        if (bVar6) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 0xffffffff;
        }
        bVar6 = MenuItem("Top-left",(char *)0x0,ShowExampleAppSimpleOverlay(bool*)::corner == 0,true
                        );
        if (bVar6) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 0;
        }
        bVar6 = MenuItem("Top-right",(char *)0x0,ShowExampleAppSimpleOverlay(bool*)::corner == 1,
                         true);
        if (bVar6) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 1;
        }
        bVar6 = MenuItem("Bottom-left",(char *)0x0,ShowExampleAppSimpleOverlay(bool*)::corner == 2,
                         true);
        if (bVar6) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 2;
        }
        bVar6 = MenuItem("Bottom-right",(char *)0x0,ShowExampleAppSimpleOverlay(bool*)::corner == 3,
                         true);
        if (bVar6) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 3;
        }
        bVar6 = MenuItem("Close",(char *)0x0,false,true);
        if (bVar6) {
          ShowDemoWindow::show_app_simple_overlay = false;
        }
        EndPopup();
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_fullscreen == true) {
    pIVar17 = GetMainViewport();
    local_e8._0_4_ = 0.0;
    local_e8._4_4_ = 0.0;
    SetNextWindowPos(&pIVar17->Pos + (ulong)ShowExampleAppFullscreen(bool*)::use_work_area * 2,0,
                     (ImVec2 *)local_e8);
    SetNextWindowSize(&pIVar17->Size + (ulong)ShowExampleAppFullscreen(bool*)::use_work_area * 2,0);
    _Var7 = Begin("Example: Fullscreen window",&ShowDemoWindow::show_app_fullscreen,
                  ShowExampleAppFullscreen(bool*)::flags);
    if (_Var7) {
      Checkbox("Use work area instead of main area",
               (bool *)&ShowExampleAppFullscreen(bool*)::use_work_area);
      SameLine(0.0,-1.0);
      HelpMarker(
                "Main Area = entire viewport,\nWork Area = entire viewport minus sections used by the main menu bars, task bars etc.\n\nEnable the main-menu bar in Examples menu to see the difference."
                );
      CheckboxFlags("ImGuiWindowFlags_NoBackground",&ShowExampleAppFullscreen(bool*)::flags,0x80);
      CheckboxFlags("ImGuiWindowFlags_NoDecoration",&ShowExampleAppFullscreen(bool*)::flags,0x2b);
      Indent(0.0);
      CheckboxFlags("ImGuiWindowFlags_NoTitleBar",&ShowExampleAppFullscreen(bool*)::flags,1);
      CheckboxFlags("ImGuiWindowFlags_NoCollapse",&ShowExampleAppFullscreen(bool*)::flags,0x20);
      CheckboxFlags("ImGuiWindowFlags_NoScrollbar",&ShowExampleAppFullscreen(bool*)::flags,8);
      Unindent(0.0);
      local_e8._0_4_ = 0.0;
      local_e8._4_4_ = 0.0;
      bVar6 = Button("Close this window",(ImVec2 *)local_e8);
      if (bVar6) {
        ShowDemoWindow::show_app_fullscreen = false;
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_window_titles == true) {
    pIVar17 = GetMainViewport();
    fVar36 = (pIVar17->Pos).y;
    local_e8._0_4_ = (pIVar17->Pos).x + 100.0;
    local_138._0_4_ = local_e8._0_4_;
    local_e8._4_4_ = fVar36 + 100.0;
    local_158.x = 0.0;
    local_158.y = 0.0;
    SetNextWindowPos((ImVec2 *)local_e8,4,&local_158);
    Begin("Same title as another window##1",(_Bool *)0x0,0);
    Text("This is window 1.\nMy title is the same as window 2, but my identifier is unique.");
    End();
    local_e8._4_4_ = fVar36 + 200.0;
    local_e8._0_4_ = local_138._0_4_;
    local_158.x = 0.0;
    local_158.y = 0.0;
    SetNextWindowPos((ImVec2 *)local_e8,4,&local_158);
    Begin("Same title as another window##2",(_Bool *)0x0,0);
    Text("This is window 2.\nMy title is the same as window 1, but my identifier is unique.");
    End();
    dVar3 = GetTime();
    cVar1 = "|/-\\"[(int)(dVar3 * 4.0) & 3];
    GetFrameCount();
    sprintf(local_e8,"Animated title %c %d###AnimatedTitle",(ulong)(uint)(int)cVar1);
    local_158.y = fVar36 + 300.0;
    local_158.x = (float)local_138._0_4_;
    local_120.x = 0.0;
    local_120.y = 0.0;
    SetNextWindowPos(&local_158,4,&local_120);
    Begin(local_e8,(_Bool *)0x0,0);
    Text("This window has a changing title.");
    End();
  }
  if (ShowDemoWindow::show_app_custom_rendering == true) {
    _Var7 = Begin("Example: Custom rendering",&ShowDemoWindow::show_app_custom_rendering,0);
    if ((_Var7) && (bVar6 = BeginTabBar("##TabBar",0), bVar6)) {
      bVar6 = BeginTabItem("Primitives",(bool *)0x0,0);
      local_50 = p_open;
      if (bVar6) {
        fVar36 = GetFontSize();
        PushItemWidth(fVar36 * -15.0);
        pIVar20 = GetWindowDrawList();
        iVar25 = 0;
        Text("Gradients");
        fVar36 = CalcItemWidth();
        local_120.y = GetFrameHeight();
        local_120.x = fVar36;
        local_e8 = (undefined1  [8])GetCursorScreenPos();
        local_158.y = (float)local_e8._4_4_ + local_120.y;
        local_158.x = (float)local_e8._0_4_ + local_120.x;
        IVar13 = GetColorU32(0xff000000);
        IVar14 = GetColorU32(0xffffffff);
        ImDrawList::AddRectFilledMultiColor
                  (pIVar20,(ImVec2 *)local_e8,&local_158,IVar13,IVar14,IVar14,IVar13);
        InvisibleButton("##gradient1",&local_120,0);
        local_e8 = (undefined1  [8])GetCursorScreenPos();
        local_158.y = (float)local_e8._4_4_ + local_120.y;
        local_158.x = (float)local_e8._0_4_ + local_120.x;
        IVar13 = GetColorU32(0xff00ff00);
        IVar14 = GetColorU32(0xff0000ff);
        ImDrawList::AddRectFilledMultiColor
                  (pIVar20,(ImVec2 *)local_e8,&local_158,IVar13,IVar14,IVar14,IVar13);
        InvisibleButton("##gradient2",&local_120,0);
        Text("All primitives");
        if (ShowExampleAppCustomRendering(bool*)::colf == '\0') {
          ShowDemoWindow();
        }
        DragFloat("Size",&ShowExampleAppCustomRendering(bool*)::sz,0.2,2.0,100.0,"%.0f",0);
        DragFloat("Thickness",&ShowExampleAppCustomRendering(bool*)::thickness,0.05,1.0,8.0,"%.02f",
                  0);
        SliderInt("N-gon sides",&ShowExampleAppCustomRendering(bool*)::ngon_sides,3,0xc,"%d",0);
        Checkbox("##circlesegmentoverride",
                 (bool *)&ShowExampleAppCustomRendering(bool*)::circle_segments_override);
        pIVar21 = GetStyle();
        SameLine(0.0,(pIVar21->ItemInnerSpacing).x);
        bVar6 = SliderInt("Circle segments override",
                          &ShowExampleAppCustomRendering(bool*)::circle_segments_override_v,3,0x28,
                          "%d",0);
        ShowExampleAppCustomRendering(bool*)::circle_segments_override =
             ShowExampleAppCustomRendering(bool*)::circle_segments_override | bVar6;
        Checkbox("##curvessegmentoverride",
                 (bool *)&ShowExampleAppCustomRendering(bool*)::curve_segments_override);
        pIVar21 = GetStyle();
        SameLine(0.0,(pIVar21->ItemInnerSpacing).x);
        bVar6 = SliderInt("Curves segments override",
                          &ShowExampleAppCustomRendering(bool*)::curve_segments_override_v,3,0x28,
                          "%d",0);
        ShowExampleAppCustomRendering(bool*)::curve_segments_override =
             ShowExampleAppCustomRendering(bool*)::curve_segments_override | bVar6;
        ColorEdit4("Color",(float *)ShowExampleAppCustomRendering(bool*)::colf,0);
        IVar4 = GetCursorScreenPos();
        local_e8 = (undefined1  [8])ShowExampleAppCustomRendering(bool*)::colf._0_8_;
        IStack_e0.x = (float)ShowExampleAppCustomRendering(bool*)::colf._8_4_;
        IStack_e0.y = (float)ShowExampleAppCustomRendering(bool*)::colf._12_4_;
        IVar13 = ColorConvertFloat4ToU32((ImVec4 *)local_e8);
        local_54 = 0;
        if (ShowExampleAppCustomRendering(bool*)::circle_segments_override != 0) {
          local_54 = ShowExampleAppCustomRendering(bool*)::circle_segments_override_v;
        }
        iVar29 = 0;
        if (ShowExampleAppCustomRendering(bool*)::curve_segments_override != 0) {
          iVar29 = ShowExampleAppCustomRendering(bool*)::curve_segments_override_v;
        }
        local_fc = ShowExampleAppCustomRendering(bool*)::sz / 5.0;
        local_168 = IVar4.x;
        fStack_164 = IVar4.y;
        local_48._4_4_ = fStack_164;
        local_48._0_4_ = local_168 + 4.0;
        uStack_40 = extraout_XMM0_Dc;
        uStack_3c = extraout_XMM0_Dd;
        fStack_164 = fStack_164 + 4.0;
        do {
          fVar36 = 1.0;
          if (iVar25 != 0) {
            fVar36 = ShowExampleAppCustomRendering(bool*)::thickness;
          }
          local_138._0_4_ = fVar36;
          fVar37 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
          local_e8._4_4_ = fVar37 + fStack_164;
          local_e8._0_4_ = fVar37 + (float)local_48._0_4_;
          ImDrawList::AddNgon(pIVar20,(ImVec2 *)local_e8,fVar37,IVar13,
                              ShowExampleAppCustomRendering(bool*)::ngon_sides,fVar36);
          fVar37 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_48._0_4_;
          fVar36 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
          local_e8._4_4_ = fVar36 + fStack_164;
          local_e8._0_4_ = fVar36 + fVar37;
          local_118._0_4_ = fVar37;
          ImDrawList::AddCircle
                    (pIVar20,(ImVec2 *)local_e8,fVar36,IVar13,local_54,(float)local_138._0_4_);
          local_118._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_118._0_4_
          ;
          local_e8._4_4_ = fStack_164;
          local_e8._0_4_ = local_118._0_4_;
          local_158.y = fStack_164 + ShowExampleAppCustomRendering(bool*)::sz;
          local_158.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_118._0_4_;
          ImDrawList::AddRect(pIVar20,(ImVec2 *)local_e8,&local_158,IVar13,0.0,0,
                              (float)local_138._0_4_);
          local_118._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_118._0_4_
          ;
          local_e8._0_4_ = local_118._0_4_;
          local_158.y = fStack_164 + ShowExampleAppCustomRendering(bool*)::sz;
          local_158.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_118._0_4_;
          ImDrawList::AddRect(pIVar20,(ImVec2 *)local_e8,&local_158,IVar13,local_fc,0,
                              (float)local_138._0_4_);
          local_118._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_118._0_4_
          ;
          local_e8._0_4_ = local_118._0_4_;
          local_158.y = fStack_164 + ShowExampleAppCustomRendering(bool*)::sz;
          local_158.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_118._0_4_;
          ImDrawList::AddRect(pIVar20,(ImVec2 *)local_e8,&local_158,IVar13,local_fc,0x90,
                              (float)local_138._0_4_);
          local_60.x = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_118._0_4_;
          local_e8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz * 0.5 + local_60.x;
          local_60.y = fStack_164 + ShowExampleAppCustomRendering(bool*)::sz + -0.5;
          local_158.y = local_60.y;
          local_158.x = ShowExampleAppCustomRendering(bool*)::sz + local_60.x;
          local_118._0_4_ = local_60.x;
          ImDrawList::AddTriangle
                    (pIVar20,(ImVec2 *)local_e8,&local_158,&local_60,IVar13,(float)local_138._0_4_);
          local_118._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_118._0_4_
          ;
          local_e8._0_4_ = local_118._0_4_;
          local_158.y = fStack_164;
          local_158.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_118._0_4_;
          ImDrawList::AddLine(pIVar20,(ImVec2 *)local_e8,&local_158,IVar13,(float)local_138._0_4_);
          local_118._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_118._0_4_
          ;
          local_e8._0_4_ = local_118._0_4_;
          local_158.y = ShowExampleAppCustomRendering(bool*)::sz + fStack_164;
          local_158.x = (float)local_118._0_4_;
          ImDrawList::AddLine(pIVar20,(ImVec2 *)local_e8,&local_158,IVar13,(float)local_138._0_4_);
          local_118._0_4_ = (float)local_118._0_4_ + 10.0;
          local_e8._0_4_ = local_118._0_4_;
          local_158.y = ShowExampleAppCustomRendering(bool*)::sz + fStack_164;
          local_158.x = (float)local_118._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
          ImDrawList::AddLine(pIVar20,(ImVec2 *)local_e8,&local_158,IVar13,(float)local_138._0_4_);
          local_158.x = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_118._0_4_;
          local_158.y = ShowExampleAppCustomRendering(bool*)::sz * 0.6 + fStack_164;
          local_150.x = ShowExampleAppCustomRendering(bool*)::sz * 0.5 + local_158.x;
          local_118._0_4_ = local_158.x;
          local_150.y = ShowExampleAppCustomRendering(bool*)::sz * -0.4 + fStack_164;
          local_148[0].y = fStack_164 + ShowExampleAppCustomRendering(bool*)::sz;
          local_148[0].x = ShowExampleAppCustomRendering(bool*)::sz + local_158.x;
          ImDrawList::AddBezierQuadratic
                    (pIVar20,&local_158,&local_150,local_148,IVar13,(float)local_138._0_4_,iVar29);
          local_e8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_118._0_4_;
          IStack_e0.y = ShowExampleAppCustomRendering(bool*)::sz * 0.3 + fStack_164;
          IStack_e0.x = ShowExampleAppCustomRendering(bool*)::sz * 1.3 + (float)local_e8._0_4_;
          local_d8.y = (ShowExampleAppCustomRendering(bool*)::sz + fStack_164) -
                       ShowExampleAppCustomRendering(bool*)::sz * 0.3;
          local_d8.x = ((float)local_e8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz) -
                       ShowExampleAppCustomRendering(bool*)::sz * 1.3;
          IStack_d0.y = ShowExampleAppCustomRendering(bool*)::sz + fStack_164;
          IStack_d0.x = (float)local_e8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
          ImDrawList::AddBezierCubic
                    (pIVar20,(ImVec2 *)local_e8,&IStack_e0,&local_d8,&IStack_d0,IVar13,
                     (float)local_138._0_4_,iVar29);
          fStack_164 = fStack_164 + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
          iVar25 = iVar25 + 1;
        } while (iVar25 == 1);
        fVar36 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
        local_e8._4_4_ = fVar36 + fStack_164;
        local_e8._0_4_ = fVar36 + (float)local_48._0_4_;
        ImDrawList::AddNgonFilled
                  (pIVar20,(ImVec2 *)local_e8,fVar36,IVar13,
                   ShowExampleAppCustomRendering(bool*)::ngon_sides);
        fVar37 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_48._0_4_;
        fVar36 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
        local_e8._4_4_ = fVar36 + fStack_164;
        local_e8._0_4_ = fVar36 + fVar37;
        local_138._0_4_ = fVar37;
        ImDrawList::AddCircleFilled(pIVar20,(ImVec2 *)local_e8,fVar36,IVar13,local_54);
        local_138._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_138._0_4_;
        local_e8._4_4_ = fStack_164;
        local_e8._0_4_ = local_138._0_4_;
        local_158.y = fStack_164 + ShowExampleAppCustomRendering(bool*)::sz;
        local_158.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_138._0_4_;
        ImDrawList::AddRectFilled(pIVar20,(ImVec2 *)local_e8,&local_158,IVar13,0.0,0);
        local_138._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_138._0_4_;
        local_e8._0_4_ = local_138._0_4_;
        local_158.y = fStack_164 + ShowExampleAppCustomRendering(bool*)::sz;
        local_158.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_138._0_4_;
        ImDrawList::AddRectFilled(pIVar20,(ImVec2 *)local_e8,&local_158,IVar13,10.0,0);
        local_138._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_138._0_4_;
        local_e8._0_4_ = local_138._0_4_;
        local_158.y = fStack_164 + ShowExampleAppCustomRendering(bool*)::sz;
        local_158.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_138._0_4_;
        ImDrawList::AddRectFilled(pIVar20,(ImVec2 *)local_e8,&local_158,IVar13,10.0,0x90);
        local_60.x = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_138._0_4_;
        local_e8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz * 0.5 + local_60.x;
        local_60.y = fStack_164 + ShowExampleAppCustomRendering(bool*)::sz + -0.5;
        local_158.y = local_60.y;
        local_158.x = ShowExampleAppCustomRendering(bool*)::sz + local_60.x;
        local_138._0_4_ = local_60.x;
        ImDrawList::AddTriangleFilled(pIVar20,(ImVec2 *)local_e8,&local_158,&local_60,IVar13);
        local_138._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_138._0_4_;
        local_e8._0_4_ = local_138._0_4_;
        local_158.y = ShowExampleAppCustomRendering(bool*)::thickness + fStack_164;
        local_158.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_138._0_4_;
        ImDrawList::AddRectFilled(pIVar20,(ImVec2 *)local_e8,&local_158,IVar13,0.0,0);
        local_138._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_138._0_4_;
        local_e8._0_4_ = local_138._0_4_;
        local_158.y = ShowExampleAppCustomRendering(bool*)::sz + fStack_164;
        local_158.x = ShowExampleAppCustomRendering(bool*)::thickness + (float)local_138._0_4_;
        ImDrawList::AddRectFilled(pIVar20,(ImVec2 *)local_e8,&local_158,IVar13,0.0,0);
        local_138._0_4_ = (float)local_138._0_4_ + 20.0;
        local_e8._0_4_ = local_138._0_4_;
        local_158.y = fStack_164 + 1.0;
        local_158.x = (float)local_138._0_4_ + 1.0;
        ImDrawList::AddRectFilled(pIVar20,(ImVec2 *)local_e8,&local_158,IVar13,0.0,0);
        local_e8._0_4_ = (float)local_138._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
        local_158.y = fStack_164 + ShowExampleAppCustomRendering(bool*)::sz;
        local_158.x = (float)local_138._0_4_ + ShowExampleAppCustomRendering(bool*)::sz +
                      ShowExampleAppCustomRendering(bool*)::sz;
        ImDrawList::AddRectFilledMultiColor
                  (pIVar20,(ImVec2 *)local_e8,&local_158,0xff000000,0xff0000ff,0xff00ffff,0xff00ff00
                  );
        local_e8._4_4_ = (ShowExampleAppCustomRendering(bool*)::sz + 10.0) * 3.0;
        local_e8._0_4_ = (ShowExampleAppCustomRendering(bool*)::sz + 10.0) * 10.2;
        Dummy((ImVec2 *)local_e8);
        PopItemWidth();
        EndTabItem();
      }
      p_open = local_50;
      bVar6 = BeginTabItem("Canvas",(bool *)0x0,0);
      if (bVar6) {
        if (ShowExampleAppCustomRendering(bool*)::points == '\0') {
          ShowDemoWindow();
        }
        if (ShowExampleAppCustomRendering(bool*)::scrolling == '\0') {
          ShowDemoWindow();
        }
        Checkbox("Enable grid",(bool *)&ShowExampleAppCustomRendering(bool*)::opt_enable_grid);
        Checkbox("Enable context menu",
                 (bool *)&ShowExampleAppCustomRendering(bool*)::opt_enable_context_menu);
        Text("Mouse Left: drag to add lines,\nMouse Right: drag to scroll, click for context menu.")
        ;
        local_e8 = (undefined1  [8])GetCursorScreenPos();
        local_158 = GetContentRegionAvail();
        if (local_158.x < 50.0) {
          local_158.x = 50.0;
        }
        if (local_158.y < 50.0) {
          local_158.y = 50.0;
        }
        local_120.y = (float)local_e8._4_4_ + local_158.y;
        local_120.x = (float)local_e8._0_4_ + local_158.x;
        pIVar18 = GetIO();
        pIVar20 = GetWindowDrawList();
        ImDrawList::AddRectFilled(pIVar20,(ImVec2 *)local_e8,&local_120,0xff323232,0.0,0);
        ImDrawList::AddRect(pIVar20,(ImVec2 *)local_e8,&local_120,0xffffffff,0.0,0,1.0);
        InvisibleButton("canvas",&local_158,3);
        _Var7 = IsItemHovered(0);
        _Var8 = IsItemActive();
        fVar36 = (float)local_e8._0_4_ + _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0;
        local_138._0_4_ = (float)local_e8._4_4_ + _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1
        ;
        local_60.x = (pIVar18->MousePos).x - fVar36;
        local_60.y = (pIVar18->MousePos).y -
                     ((float)local_e8._4_4_ + _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1);
        if (((_Var7) && (ShowExampleAppCustomRendering(bool*)::adding_line == '\0')) &&
           (_Var7 = IsMouseClicked(0,false), _Var7)) {
          ImVector<ImVec2>::push_back
                    ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,&local_60);
          ImVector<ImVec2>::push_back
                    ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,&local_60);
          ShowExampleAppCustomRendering(bool*)::adding_line = '\x01';
        }
        p_open = local_50;
        if (ShowExampleAppCustomRendering(bool*)::adding_line == '\x01') {
          if ((long)ShowExampleAppCustomRendering(bool*)::points < 1) {
            __assert_fail("Size > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                          ,0x70f,"T &ImVector<ImVec2>::back() [T = ImVec2]");
          }
          *(ulong *)((long)DAT_0030ec18 +
                    (long)ShowExampleAppCustomRendering(bool*)::points * 8 + -8) =
               CONCAT44(local_60.y,local_60.x);
          _Var7 = IsMouseDown(0);
          if (!_Var7) {
            ShowExampleAppCustomRendering(bool*)::adding_line = '\0';
          }
        }
        if (_Var8) {
          if (ShowExampleAppCustomRendering(bool*)::opt_enable_context_menu == '\0') {
            fVar37 = 0.0;
          }
          else {
            fVar37 = -1.0;
          }
          _Var7 = IsMouseDragging(1,fVar37);
          if (_Var7) {
            _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0 =
                 (pIVar18->MouseDelta).x + _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0;
            _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1 =
                 (pIVar18->MouseDelta).y + _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1;
          }
        }
        IVar4 = GetMouseDragDelta(1,-1.0);
        if (ShowExampleAppCustomRendering(bool*)::opt_enable_context_menu == '\x01') {
          local_118._8_4_ = extraout_XMM0_Dc_00;
          local_118._0_4_ = IVar4.x;
          local_118._4_4_ = IVar4.y;
          local_118._12_4_ = extraout_XMM0_Dd_00;
          _Var7 = IsMouseReleased(1);
          if (((_Var7) && ((float)local_118._0_4_ == 0.0)) &&
             ((!NAN((float)local_118._0_4_) &&
              (((float)local_118._4_4_ == 0.0 && (!NAN((float)local_118._4_4_))))))) {
            OpenPopupOnItemClick("context",1);
          }
        }
        _Var7 = BeginPopup("context",0);
        if (_Var7) {
          if (ShowExampleAppCustomRendering(bool*)::adding_line == '\x01') {
            uVar12 = ShowExampleAppCustomRendering(bool*)::points - 2;
            if (DAT_0030ec14 < (int)uVar12) {
              if (DAT_0030ec14 == 0) {
                uVar24 = 8;
              }
              else {
                uVar24 = DAT_0030ec14 / 2 + DAT_0030ec14;
              }
              if ((int)uVar24 <= (int)uVar12) {
                uVar24 = uVar12;
              }
              if (DAT_0030ec14 < (int)uVar24) {
                pvVar19 = MemAlloc((long)(int)uVar24 << 3);
                if (DAT_0030ec18 != (void *)0x0) {
                  memcpy(pvVar19,DAT_0030ec18,
                         (long)ShowExampleAppCustomRendering(bool*)::points << 3);
                  MemFree(DAT_0030ec18);
                }
                _points = (ulong)uVar24 << 0x20;
                DAT_0030ec18 = pvVar19;
              }
            }
            _points = CONCAT44(DAT_0030ec14,uVar12);
          }
          ShowExampleAppCustomRendering(bool*)::adding_line = '\0';
          bVar6 = MenuItem("Remove one",(char *)0x0,false,
                           0 < ShowExampleAppCustomRendering(bool*)::points);
          if (bVar6) {
            uVar12 = ShowExampleAppCustomRendering(bool*)::points - 2;
            if (DAT_0030ec14 < (int)uVar12) {
              if (DAT_0030ec14 == 0) {
                uVar24 = 8;
              }
              else {
                uVar24 = DAT_0030ec14 / 2 + DAT_0030ec14;
              }
              if ((int)uVar24 <= (int)uVar12) {
                uVar24 = uVar12;
              }
              if (DAT_0030ec14 < (int)uVar24) {
                pvVar19 = MemAlloc((long)(int)uVar24 << 3);
                if (DAT_0030ec18 != (void *)0x0) {
                  memcpy(pvVar19,DAT_0030ec18,
                         (long)ShowExampleAppCustomRendering(bool*)::points << 3);
                  MemFree(DAT_0030ec18);
                }
                _points = (ulong)uVar24 << 0x20;
                DAT_0030ec18 = pvVar19;
              }
            }
            _points = CONCAT44(DAT_0030ec14,uVar12);
          }
          bVar6 = MenuItem("Remove all",(char *)0x0,false,
                           0 < ShowExampleAppCustomRendering(bool*)::points);
          if ((bVar6) && (DAT_0030ec18 != (void *)0x0)) {
            _points = 0;
            MemFree(DAT_0030ec18);
            DAT_0030ec18 = (void *)0x0;
          }
          EndPopup();
        }
        ImDrawList::PushClipRect(pIVar20,(ImVec2)local_e8,local_120,true);
        if (ShowExampleAppCustomRendering(bool*)::opt_enable_grid == '\x01') {
          fVar37 = fmodf(_ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0,64.0);
          if (fVar37 < local_158.x) {
            do {
              local_118._0_4_ = fVar37;
              local_f8.x = (float)local_e8._0_4_ + fVar37;
              local_f0.y = (float)local_e8._4_4_;
              local_f8.y = local_120.y;
              local_f0.x = local_f8.x;
              ImDrawList::AddLine(pIVar20,&local_f0,&local_f8,0x28c8c8c8,1.0);
              fVar37 = (float)local_118._0_4_ + 64.0;
            } while (fVar37 < local_158.x);
          }
          fVar37 = fmodf(_ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1,64.0);
          if (fVar37 < local_158.y) {
            do {
              local_118._0_4_ = fVar37;
              local_f8.y = (float)local_e8._4_4_ + fVar37;
              local_f0.x = (float)local_e8._0_4_;
              local_f8.x = local_120.x;
              local_f0.y = local_f8.y;
              ImDrawList::AddLine(pIVar20,&local_f0,&local_f8,0x28c8c8c8,1.0);
              fVar37 = (float)local_118._0_4_ + 64.0;
            } while (fVar37 < local_158.y);
          }
        }
        if (0 < ShowExampleAppCustomRendering(bool*)::points) {
          lVar27 = 1;
          do {
            local_f0.x = *(float *)((long)DAT_0030ec18 + lVar27 * 8 + -8) + fVar36;
            local_f0.y = *(float *)((long)DAT_0030ec18 + lVar27 * 8 + -4) + (float)local_138._0_4_;
            if (ShowExampleAppCustomRendering(bool*)::points <= lVar27) {
              __assert_fail("i >= 0 && i < Size",
                            "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                            ,0x706,"T &ImVector<ImVec2>::operator[](int) [T = ImVec2]");
            }
            local_f8.x = *(float *)((long)DAT_0030ec18 + lVar27 * 8) + fVar36;
            local_f8.y = *(float *)((long)DAT_0030ec18 + lVar27 * 8 + 4) + (float)local_138._0_4_;
            ImDrawList::AddLine(pIVar20,&local_f0,&local_f8,0xff00ffff,2.0);
            iVar25 = (int)lVar27;
            lVar27 = lVar27 + 2;
          } while (iVar25 + 1 < ShowExampleAppCustomRendering(bool*)::points);
        }
        ImDrawList::PopClipRect(pIVar20);
        EndTabItem();
      }
      bVar6 = BeginTabItem("BG/FG draw lists",(bool *)0x0,0);
      if (bVar6) {
        Checkbox("Draw in Background draw list",
                 (bool *)&ShowExampleAppCustomRendering(bool*)::draw_bg);
        SameLine(0.0,-1.0);
        HelpMarker("The Background draw list will be rendered below every Dear ImGui windows.");
        Checkbox("Draw in Foreground draw list",
                 (bool *)&ShowExampleAppCustomRendering(bool*)::draw_fg);
        SameLine(0.0,-1.0);
        HelpMarker("The Foreground draw list will be rendered over every Dear ImGui windows.");
        IVar4 = GetWindowPos();
        IVar5 = GetWindowSize();
        local_168 = IVar4.x;
        fStack_164 = IVar4.y;
        local_e8._4_4_ = IVar5.y * 0.5 + fStack_164;
        local_e8._0_4_ = IVar5.x * 0.5 + local_168;
        if (ShowExampleAppCustomRendering(bool*)::draw_bg == '\x01') {
          local_138._8_4_ = extraout_XMM0_Dc_01;
          local_138._0_4_ = IVar5.x;
          local_138._4_4_ = IVar5.y;
          local_138._12_4_ = extraout_XMM0_Dd_01;
          pIVar20 = GetBackgroundDrawList();
          ImDrawList::AddCircle
                    (pIVar20,(ImVec2 *)local_e8,(float)local_138._0_4_ * 0.6,0xc80000ff,0,14.0);
        }
        if (ShowExampleAppCustomRendering(bool*)::draw_fg == '\x01') {
          pIVar20 = GetForegroundDrawList();
          ImDrawList::AddCircle(pIVar20,(ImVec2 *)local_e8,IVar5.y * 0.6,0xc800ff00,0,10.0);
        }
        EndTabItem();
      }
      EndTabBar();
    }
    End();
  }
  if (ShowDemoWindow::show_app_metrics == true) {
    ShowMetricsWindow(&ShowDemoWindow::show_app_metrics);
  }
  if (ShowDemoWindow::show_app_stack_tool == true) {
    ShowStackToolWindow(&ShowDemoWindow::show_app_stack_tool);
  }
  if (ShowDemoWindow::show_app_about == true) {
    ShowAboutWindow(&ShowDemoWindow::show_app_about);
  }
  if (ShowDemoWindow::show_app_style_editor == true) {
    Begin("Dear ImGui Style Editor",&ShowDemoWindow::show_app_style_editor,0);
    ShowStyleEditor((ImGuiStyle *)0x0);
    End();
  }
  uVar12 = ShowDemoWindow::no_titlebar + 8;
  if (ShowDemoWindow::no_scrollbar == false) {
    uVar12 = (uint)ShowDemoWindow::no_titlebar;
  }
  uVar24 = uVar12 + 0x400;
  if (ShowDemoWindow::no_menu != false) {
    uVar24 = uVar12;
  }
  uVar12 = uVar24 + 4;
  if (ShowDemoWindow::no_move == false) {
    uVar12 = uVar24;
  }
  uVar24 = uVar12 | 2;
  if (ShowDemoWindow::no_resize == false) {
    uVar24 = uVar12;
  }
  uVar12 = uVar24 | 0x20;
  if (ShowDemoWindow::no_collapse == false) {
    uVar12 = uVar24;
  }
  uVar24 = uVar12 | 0xc0000;
  if (ShowDemoWindow::no_nav == false) {
    uVar24 = uVar12;
  }
  uVar12 = uVar24 | 0x80;
  if (ShowDemoWindow::no_background == false) {
    uVar12 = uVar24;
  }
  uVar24 = uVar12 | 0x2000;
  if (ShowDemoWindow::no_bring_to_front == false) {
    uVar24 = uVar12;
  }
  uVar12 = uVar24 | 0x200000;
  if (ShowDemoWindow::no_docking == false) {
    uVar12 = uVar24;
  }
  uVar24 = uVar12 | 0x100000;
  if (ShowDemoWindow::unsaved_document == false) {
    uVar24 = uVar12;
  }
  if (ShowDemoWindow::no_close != false) {
    p_open = (_Bool *)0x0;
  }
  pIVar17 = GetMainViewport();
  local_e8._4_4_ = (pIVar17->WorkPos).y + 20.0;
  local_e8._0_4_ = (pIVar17->WorkPos).x + 650.0;
  local_158.x = 0.0;
  local_158.y = 0.0;
  SetNextWindowPos((ImVec2 *)local_e8,4,&local_158);
  local_e8._0_4_ = 550.0;
  local_e8._4_4_ = 680.0;
  SetNextWindowSize((ImVec2 *)local_e8,4);
  _Var7 = Begin("Dear ImGui Demo",p_open,uVar24);
  if (_Var7) {
    fVar36 = GetFontSize();
    PushItemWidth(fVar36 * -12.0);
    bVar6 = BeginMenuBar();
    if (bVar6) {
      bVar6 = BeginMenu("Menu",true);
      if (bVar6) {
        ShowExampleMenuFile();
        EndMenu();
      }
      bVar6 = BeginMenu("Examples",true);
      if (bVar6) {
        MenuItem("Main menu bar",(char *)0x0,&ShowDemoWindow::show_app_main_menu_bar,true);
        MenuItem("Console",(char *)0x0,&ShowDemoWindow::show_app_console,true);
        MenuItem("Log",(char *)0x0,&ShowDemoWindow::show_app_log,true);
        MenuItem("Simple layout",(char *)0x0,&ShowDemoWindow::show_app_layout,true);
        MenuItem("Property editor",(char *)0x0,&ShowDemoWindow::show_app_property_editor,true);
        MenuItem("Long text display",(char *)0x0,&ShowDemoWindow::show_app_long_text,true);
        MenuItem("Auto-resizing window",(char *)0x0,&ShowDemoWindow::show_app_auto_resize,true);
        MenuItem("Constrained-resizing window",(char *)0x0,
                 &ShowDemoWindow::show_app_constrained_resize,true);
        MenuItem("Simple overlay",(char *)0x0,&ShowDemoWindow::show_app_simple_overlay,true);
        MenuItem("Fullscreen window",(char *)0x0,&ShowDemoWindow::show_app_fullscreen,true);
        MenuItem("Manipulating window titles",(char *)0x0,&ShowDemoWindow::show_app_window_titles,
                 true);
        MenuItem("Custom rendering",(char *)0x0,&ShowDemoWindow::show_app_custom_rendering,true);
        MenuItem("Dockspace",(char *)0x0,&ShowDemoWindow::show_app_dockspace,true);
        MenuItem("Documents",(char *)0x0,&ShowDemoWindow::show_app_documents,true);
        EndMenu();
      }
      bVar6 = BeginMenu("Tools",true);
      if (bVar6) {
        MenuItem("Metrics/Debugger",(char *)0x0,&ShowDemoWindow::show_app_metrics,true);
        MenuItem("Stack Tool",(char *)0x0,&ShowDemoWindow::show_app_stack_tool,true);
        MenuItem("Style Editor",(char *)0x0,&ShowDemoWindow::show_app_style_editor,true);
        MenuItem("About Dear ImGui",(char *)0x0,&ShowDemoWindow::show_app_about,true);
        EndMenu();
      }
      EndMenuBar();
    }
    Text("dear imgui says hello. (%s)");
    Spacing();
    bVar6 = CollapsingHeader("Help",0);
    if (bVar6) {
      Text("ABOUT THIS DEMO:");
      BulletText("Sections below are demonstrating many aspects of the library.");
      BulletText("The \"Examples\" menu above leads to more demo contents.");
      BulletText(
                "The \"Tools\" menu above gives access to: About Box, Style Editor,\nand Metrics/Debugger (general purpose Dear ImGui debugging tool)."
                );
      Separator();
      Text("PROGRAMMER GUIDE:");
      BulletText("See the ShowDemoWindow() code in imgui_demo.cpp. <- you are here!");
      BulletText("See comments in imgui.cpp.");
      BulletText("See example applications in the examples/ folder.");
      BulletText("Read the FAQ at http://www.dearimgui.org/faq/");
      BulletText("Set \'io.ConfigFlags |= NavEnableKeyboard\' for keyboard controls.");
      BulletText("Set \'io.ConfigFlags |= NavEnableGamepad\' for gamepad controls.");
      Separator();
      Text("USER GUIDE:");
      ShowUserGuide();
    }
    bVar6 = CollapsingHeader("Configuration",0);
    if (bVar6) {
      pIVar18 = GetIO();
      bVar6 = TreeNode("Configuration##2");
      if (bVar6) {
        CheckboxFlags("io.ConfigFlags: NavEnableKeyboard",&pIVar18->ConfigFlags,1);
        SameLine(0.0,-1.0);
        HelpMarker("Enable keyboard controls.");
        CheckboxFlags("io.ConfigFlags: NavEnableGamepad",&pIVar18->ConfigFlags,2);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable gamepad controls. Require backend to set io.BackendFlags |= ImGuiBackendFlags_HasGamepad.\n\nRead instructions in imgui.cpp for details."
                  );
        CheckboxFlags("io.ConfigFlags: NavEnableSetMousePos",&pIVar18->ConfigFlags,4);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Instruct navigation to move the mouse cursor. See comment for ImGuiConfigFlags_NavEnableSetMousePos."
                  );
        CheckboxFlags("io.ConfigFlags: NoMouse",&pIVar18->ConfigFlags,0x10);
        if ((pIVar18->ConfigFlags & 0x10) != 0) {
          dVar3 = GetTime();
          fVar36 = fmodf((float)dVar3,0.4);
          if (fVar36 < 0.2) {
            SameLine(0.0,-1.0);
            Text("<<PRESS SPACE TO DISABLE>>");
          }
          iVar25 = GetKeyIndex(0xc);
          _Var7 = IsKeyPressed(iVar25,true);
          if (_Var7) {
            *(byte *)&pIVar18->ConfigFlags = (byte)pIVar18->ConfigFlags & 0xef;
          }
        }
        CheckboxFlags("io.ConfigFlags: NoMouseCursorChange",&pIVar18->ConfigFlags,0x20);
        SameLine(0.0,-1.0);
        HelpMarker("Instruct backend to not alter mouse cursor shape and visibility.");
        CheckboxFlags("io.ConfigFlags: DockingEnable",&pIVar18->ConfigFlags,0x40);
        SameLine(0.0,-1.0);
        pcVar30 = 
        "Drag from window title bar or their tab to dock/undock. Hold SHIFT to disable docking.\n\nDrag from window menu button (upper-left button) to undock an entire node (all windows)."
        ;
        if (pIVar18->ConfigDockingWithShift != false) {
          pcVar30 = 
          "Drag from window title bar or their tab to dock/undock. Hold SHIFT to enable docking.\n\nDrag from window menu button (upper-left button) to undock an entire node (all windows)."
          ;
        }
        HelpMarker(pcVar30);
        if ((pIVar18->ConfigFlags & 0x40) != 0) {
          Indent(0.0);
          Checkbox("io.ConfigDockingNoSplit",&pIVar18->ConfigDockingNoSplit);
          SameLine(0.0,-1.0);
          HelpMarker(
                    "Simplified docking mode: disable window splitting, so docking is limited to merging multiple windows together into tab-bars."
                    );
          Checkbox("io.ConfigDockingWithShift",&pIVar18->ConfigDockingWithShift);
          SameLine(0.0,-1.0);
          HelpMarker(
                    "Enable docking when holding Shift only (allow to drop in wider space, reduce visual noise)"
                    );
          Checkbox("io.ConfigDockingAlwaysTabBar",&pIVar18->ConfigDockingAlwaysTabBar);
          SameLine(0.0,-1.0);
          HelpMarker("Create a docking node and tab-bar on single floating windows.");
          Checkbox("io.ConfigDockingTransparentPayload",&pIVar18->ConfigDockingTransparentPayload);
          SameLine(0.0,-1.0);
          HelpMarker(
                    "Make window or viewport transparent when docking and only display docking boxes on the target viewport. Useful if rendering of multiple viewport cannot be synced. Best used with ConfigViewportsNoAutoMerge."
                    );
          Unindent(0.0);
        }
        CheckboxFlags("io.ConfigFlags: ViewportsEnable",&pIVar18->ConfigFlags,0x400);
        SameLine(0.0,-1.0);
        HelpMarker("[beta] Enable beta multi-viewports support. See ImGuiPlatformIO for details.");
        if ((pIVar18->ConfigFlags & 0x400) != 0) {
          Indent(0.0);
          Checkbox("io.ConfigViewportsNoAutoMerge",&pIVar18->ConfigViewportsNoAutoMerge);
          SameLine(0.0,-1.0);
          HelpMarker(
                    "Set to make all floating imgui windows always create their own viewport. Otherwise, they are merged into the main host viewports when overlapping it."
                    );
          Checkbox("io.ConfigViewportsNoTaskBarIcon",&pIVar18->ConfigViewportsNoTaskBarIcon);
          SameLine(0.0,-1.0);
          HelpMarker(
                    "Toggling this at runtime is normally unsupported (most platform backends won\'t refresh the task bar icon state right away)."
                    );
          Checkbox("io.ConfigViewportsNoDecoration",&pIVar18->ConfigViewportsNoDecoration);
          SameLine(0.0,-1.0);
          HelpMarker(
                    "Toggling this at runtime is normally unsupported (most platform backends won\'t refresh the decoration right away)."
                    );
          Checkbox("io.ConfigViewportsNoDefaultParent",&pIVar18->ConfigViewportsNoDefaultParent);
          SameLine(0.0,-1.0);
          HelpMarker(
                    "Toggling this at runtime is normally unsupported (most platform backends won\'t refresh the parenting right away)."
                    );
          Unindent(0.0);
        }
        Checkbox("io.ConfigInputTextCursorBlink",&pIVar18->ConfigInputTextCursorBlink);
        SameLine(0.0,-1.0);
        HelpMarker("Enable blinking cursor (optional as some users consider it to be distracting)");
        Checkbox("io.ConfigDragClickToInputText",&pIVar18->ConfigDragClickToInputText);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable turning DragXXX widgets into text input with a simple mouse click-release (without moving)."
                  );
        Checkbox("io.ConfigWindowsResizeFromEdges",&pIVar18->ConfigWindowsResizeFromEdges);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable resizing of windows from their edges and from the lower-left corner.\nThis requires (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors) because it needs mouse cursor feedback."
                  );
        Checkbox("io.ConfigWindowsMoveFromTitleBarOnly",&pIVar18->ConfigWindowsMoveFromTitleBarOnly)
        ;
        Checkbox("io.MouseDrawCursor",&pIVar18->MouseDrawCursor);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Instruct Dear ImGui to render a mouse cursor itself. Note that a mouse cursor rendered via your application GPU rendering path will feel more laggy than hardware cursor, but will be more in sync with your other visuals.\n\nSome desktop applications may use both kinds of cursors (e.g. enable software cursor only when resizing/dragging something)."
                  );
        Text("Also see Style->Rendering for rendering options.");
        TreePop();
        Separator();
      }
      bVar6 = TreeNode("Backend Flags");
      if (bVar6) {
        HelpMarker(
                  "Those flags are set by the backends (imgui_impl_xxx files) to specify their capabilities.\nHere we expose them as read-only fields to avoid breaking interactions with your backend."
                  );
        local_e8._0_4_ = pIVar18->BackendFlags;
        CheckboxFlags("io.BackendFlags: HasGamepad",(int *)local_e8,1);
        CheckboxFlags("io.BackendFlags: HasMouseCursors",(int *)local_e8,2);
        CheckboxFlags("io.BackendFlags: HasSetMousePos",(int *)local_e8,4);
        CheckboxFlags("io.BackendFlags: PlatformHasViewports",(int *)local_e8,0x400);
        CheckboxFlags("io.BackendFlags: HasMouseHoveredViewport",(int *)local_e8,0x800);
        CheckboxFlags("io.BackendFlags: RendererHasVtxOffset",(int *)local_e8,8);
        CheckboxFlags("io.BackendFlags: RendererHasViewports",(int *)local_e8,0x1000);
        TreePop();
        Separator();
      }
      bVar6 = TreeNode("Style");
      if (bVar6) {
        HelpMarker(
                  "The same contents can be accessed in \'Tools->Style Editor\' or by calling the ShowStyleEditor() function."
                  );
        ShowStyleEditor((ImGuiStyle *)0x0);
        TreePop();
        Separator();
      }
      bVar6 = TreeNode("Capture/Logging");
      if (bVar6) {
        HelpMarker(
                  "The logging API redirects all text output so you can easily capture the content of a window or a block. Tree nodes can be automatically expanded.\nTry opening any of the contents below in this window and then click one of the \"Log To\" button."
                  );
        LogButtons();
        HelpMarker(
                  "You can also call ImGui::LogText() to output directly to the log without a visual output."
                  );
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar6 = Button("Copy \"Hello, world!\" to clipboard",(ImVec2 *)local_e8);
        if (bVar6) {
          LogToClipboard(-1);
          LogText("Hello, world!");
          LogFinish();
        }
        TreePop();
      }
    }
    bVar6 = CollapsingHeader("Window options",0);
    if (bVar6) {
      local_e8._0_4_ = 0.0;
      local_e8._4_4_ = 0.0;
      bVar6 = BeginTable("split",3,0,(ImVec2 *)local_e8,0.0);
      if (bVar6) {
        TableNextColumn();
        Checkbox("No titlebar",&ShowDemoWindow::no_titlebar);
        TableNextColumn();
        Checkbox("No scrollbar",&ShowDemoWindow::no_scrollbar);
        TableNextColumn();
        Checkbox("No menu",&ShowDemoWindow::no_menu);
        TableNextColumn();
        Checkbox("No move",&ShowDemoWindow::no_move);
        TableNextColumn();
        Checkbox("No resize",&ShowDemoWindow::no_resize);
        TableNextColumn();
        Checkbox("No collapse",&ShowDemoWindow::no_collapse);
        TableNextColumn();
        Checkbox("No close",&ShowDemoWindow::no_close);
        TableNextColumn();
        Checkbox("No nav",&ShowDemoWindow::no_nav);
        TableNextColumn();
        Checkbox("No background",&ShowDemoWindow::no_background);
        TableNextColumn();
        Checkbox("No bring to front",&ShowDemoWindow::no_bring_to_front);
        TableNextColumn();
        Checkbox("No docking",&ShowDemoWindow::no_docking);
        TableNextColumn();
        Checkbox("Unsaved document",&ShowDemoWindow::unsaved_document);
        EndTable();
      }
    }
    ShowDemoWindowWidgets();
    ShowDemoWindowLayout();
    bVar6 = CollapsingHeader("Popups & Modal windows",0);
    if (bVar6) {
      bVar6 = TreeNode("Popups");
      if (bVar6) {
        TextWrapped(
                   "When a popup is active, it inhibits interacting with windows that are behind the popup. Clicking outside the popup closes it."
                   );
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar6 = Button("Select..",(ImVec2 *)local_e8);
        if (bVar6) {
          OpenPopup("my_select_popup",0);
        }
        SameLine(0.0,-1.0);
        if ((long)ShowDemoWindowPopups()::selected_fish == -1) {
          pcVar30 = "<None>";
        }
        else {
          pcVar30 = (&PTR_anon_var_dwarf_181d09_002d57a0)[ShowDemoWindowPopups()::selected_fish];
        }
        TextUnformatted(pcVar30,(char *)0x0);
        _Var7 = BeginPopup("my_select_popup",0);
        if (_Var7) {
          lVar27 = 0;
          Text("Aquarium");
          Separator();
          ppuVar35 = &PTR_anon_var_dwarf_181d09_002d57a0;
          do {
            local_e8._0_4_ = 0.0;
            local_e8._4_4_ = 0.0;
            bVar6 = Selectable(*ppuVar35,false,0,(ImVec2 *)local_e8);
            if (bVar6) {
              ShowDemoWindowPopups()::selected_fish = (int)lVar27;
            }
            lVar27 = lVar27 + 1;
            ppuVar35 = ppuVar35 + 1;
          } while (lVar27 != 5);
          EndPopup();
        }
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar6 = Button("Toggle..",(ImVec2 *)local_e8);
        if (bVar6) {
          OpenPopup("my_toggle_popup",0);
        }
        _Var7 = BeginPopup("my_toggle_popup",0);
        if (_Var7) {
          pbVar26 = (bool *)&ShowDemoWindowPopups()::toggles;
          lVar27 = 0;
          do {
            MenuItem(*(char **)((long)&PTR_anon_var_dwarf_181d09_002d57a0 + lVar27),"",pbVar26,true)
            ;
            lVar27 = lVar27 + 8;
            pbVar26 = pbVar26 + 1;
          } while (lVar27 != 0x28);
          bVar6 = BeginMenu("Sub-menu",true);
          if (bVar6) {
            MenuItem("Click me",(char *)0x0,false,true);
            EndMenu();
          }
          Separator();
          Text("Tooltip here");
          _Var7 = IsItemHovered(0);
          if (_Var7) {
            SetTooltip("I am a tooltip over a popup");
          }
          local_e8._0_4_ = 0.0;
          local_e8._4_4_ = 0.0;
          bVar6 = Button("Stacked Popup",(ImVec2 *)local_e8);
          if (bVar6) {
            OpenPopup("another popup",0);
          }
          _Var7 = BeginPopup("another popup",0);
          if (_Var7) {
            pbVar26 = (bool *)&ShowDemoWindowPopups()::toggles;
            lVar27 = 0;
            do {
              MenuItem(*(char **)((long)&PTR_anon_var_dwarf_181d09_002d57a0 + lVar27),"",pbVar26,
                       true);
              lVar27 = lVar27 + 8;
              pbVar26 = pbVar26 + 1;
            } while (lVar27 != 0x28);
            bVar6 = BeginMenu("Sub-menu",true);
            if (bVar6) {
              MenuItem("Click me",(char *)0x0,false,true);
              local_e8._0_4_ = 0.0;
              local_e8._4_4_ = 0.0;
              bVar6 = Button("Stacked Popup",(ImVec2 *)local_e8);
              if (bVar6) {
                OpenPopup("another popup",0);
              }
              _Var7 = BeginPopup("another popup",0);
              if (_Var7) {
                Text("I am the last one here.");
                EndPopup();
              }
              EndMenu();
            }
            EndPopup();
          }
          EndPopup();
        }
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar6 = Button("File Menu..",(ImVec2 *)local_e8);
        if (bVar6) {
          OpenPopup("my_file_popup",0);
        }
        _Var7 = BeginPopup("my_file_popup",0);
        if (_Var7) {
          ShowExampleMenuFile();
          EndPopup();
        }
        TreePop();
      }
      bVar6 = TreeNode("Context menus");
      if (bVar6) {
        HelpMarker(
                  "\"Context\" functions are simple helpers to associate a Popup to a given Item or Window identifier."
                  );
        lVar27 = 0;
        do {
          pcVar30 = *(char **)((long)&PTR_anon_var_dwarf_181e1d_002d57d0 + lVar27);
          local_e8._0_4_ = 0.0;
          local_e8._4_4_ = 0.0;
          Selectable(pcVar30,false,0,(ImVec2 *)local_e8);
          _Var7 = BeginPopupContextItem((char *)0x0,1);
          if (_Var7) {
            Text("This a popup for \"%s\"!",pcVar30);
            local_e8._0_4_ = 0.0;
            local_e8._4_4_ = 0.0;
            bVar6 = Button("Close",(ImVec2 *)local_e8);
            if (bVar6) {
              CloseCurrentPopup();
            }
            EndPopup();
          }
          _Var7 = IsItemHovered(0);
          if (_Var7) {
            SetTooltip("Right-click to open popup");
          }
          lVar27 = lVar27 + 8;
        } while (lVar27 != 0x28);
        HelpMarker("Text() elements don\'t have stable identifiers so we need to provide one.");
        Text("Value = %.3f <-- (1) right-click this value",
             SUB84((double)ShowDemoWindowPopups()::value,0));
        _Var7 = BeginPopupContextItem("my popup",1);
        if (_Var7) {
          local_e8._0_4_ = 0.0;
          local_e8._4_4_ = 0.0;
          bVar6 = Selectable("Set to zero",false,0,(ImVec2 *)local_e8);
          if (bVar6) {
            ShowDemoWindowPopups()::value = 0.0;
          }
          local_e8._0_4_ = 0.0;
          local_e8._4_4_ = 0.0;
          bVar6 = Selectable("Set to PI",false,0,(ImVec2 *)local_e8);
          if (bVar6) {
            ShowDemoWindowPopups()::value = 3.1415;
          }
          SetNextItemWidth(-1.1754944e-38);
          DragFloat("##Value",&ShowDemoWindowPopups()::value,0.1,0.0,0.0,"%.3f",0);
          EndPopup();
        }
        Text("(2) Or right-click this text");
        OpenPopupOnItemClick("my popup",1);
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar6 = Button("(3) Or click this button",(ImVec2 *)local_e8);
        if (bVar6) {
          OpenPopup("my popup",0);
        }
        HelpMarker(
                  "Showcase using a popup ID linked to item ID, with the item having a changing label + stable ID using the ### operator."
                  );
        sprintf(local_e8,"Button: %s###Button",ShowDemoWindowPopups()::name);
        local_158.x = 0.0;
        local_158.y = 0.0;
        Button(local_e8,&local_158);
        _Var7 = BeginPopupContextItem((char *)0x0,1);
        if (_Var7) {
          Text("Edit name:");
          InputText("##edit",ShowDemoWindowPopups()::name,0x20,0,(ImGuiInputTextCallback)0x0,
                    (void *)0x0);
          local_158.x = 0.0;
          local_158.y = 0.0;
          bVar6 = Button("Close",&local_158);
          if (bVar6) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        SameLine(0.0,-1.0);
        Text("(<-- right-click here)");
        TreePop();
      }
      bVar6 = TreeNode("Modals");
      if (bVar6) {
        TextWrapped(
                   "Modal windows are like popups but the user cannot close them by clicking outside."
                   );
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar6 = Button("Delete..",(ImVec2 *)local_e8);
        if (bVar6) {
          OpenPopup("Delete?",0);
        }
        pIVar17 = GetMainViewport();
        local_e8._4_4_ = (pIVar17->Size).y * 0.5 + (pIVar17->Pos).y;
        local_e8._0_4_ = (pIVar17->Size).x * 0.5 + (pIVar17->Pos).x;
        local_158.x = 0.5;
        local_158.y = 0.5;
        SetNextWindowPos((ImVec2 *)local_e8,8,&local_158);
        _Var7 = BeginPopupModal("Delete?",(_Bool *)0x0,0x40);
        if (_Var7) {
          Text("All those beautiful files will be deleted.\nThis operation cannot be undone!\n\n");
          Separator();
          local_158.x = 0.0;
          local_158.y = 0.0;
          PushStyleVar(0xb,&local_158);
          Checkbox("Don\'t ask me next time",(bool *)&ShowDemoWindowPopups()::dont_ask_me_next_time)
          ;
          PopStyleVar(1);
          local_158.x = 120.0;
          local_158.y = 0.0;
          this = (ImGui *)0x278bb2;
          bVar6 = Button("OK",&local_158);
          if (bVar6) {
            CloseCurrentPopup();
          }
          SetItemDefaultFocus(this);
          SameLine(0.0,-1.0);
          local_158.x = 120.0;
          local_158.y = 0.0;
          bVar6 = Button("Cancel",&local_158);
          if (bVar6) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        local_158.x = 0.0;
        local_158.y = 0.0;
        bVar6 = Button("Stacked modals..",&local_158);
        if (bVar6) {
          OpenPopup("Stacked 1",0);
        }
        _Var7 = BeginPopupModal("Stacked 1",(_Bool *)0x0,0x400);
        if (_Var7) {
          bVar6 = BeginMenuBar();
          if (bVar6) {
            bVar6 = BeginMenu("File",true);
            if (bVar6) {
              MenuItem("Some menu item",(char *)0x0,false,true);
              EndMenu();
            }
            EndMenuBar();
          }
          Text(
              "Hello from Stacked The First\nUsing style.Colors[ImGuiCol_ModalWindowDimBg] behind it."
              );
          Combo("Combo",&ShowDemoWindowPopups()::item,"aaaa",-1);
          ColorEdit4("color",(float *)ShowDemoWindowPopups()::color,0);
          local_158.x = 0.0;
          local_158.y = 0.0;
          bVar6 = Button("Add another modal..",&local_158);
          if (bVar6) {
            OpenPopup("Stacked 2",0);
          }
          local_120.x._0_1_ = 1;
          _Var7 = BeginPopupModal("Stacked 2",(_Bool *)&local_120,0);
          if (_Var7) {
            Text("Hello from Stacked The Second!");
            local_158.x = 0.0;
            local_158.y = 0.0;
            bVar6 = Button("Close",&local_158);
            if (bVar6) {
              CloseCurrentPopup();
            }
            EndPopup();
          }
          local_158.x = 0.0;
          local_158.y = 0.0;
          bVar6 = Button("Close",&local_158);
          if (bVar6) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        TreePop();
      }
      bVar6 = TreeNode("Menus inside a regular window");
      if (bVar6) {
        TextWrapped(
                   "Below we are testing adding menu items to a regular window. It\'s rather unusual but should work!"
                   );
        Separator();
        PushID("foo");
        MenuItem("Menu item","CTRL+M",false,true);
        bVar6 = BeginMenu("Menu inside a regular window",true);
        if (bVar6) {
          ShowExampleMenuFile();
          EndMenu();
        }
        PopID();
        Separator();
        TreePop();
      }
    }
    ShowDemoWindowTables();
    bVar6 = CollapsingHeader("Filtering",0);
    if (bVar6) {
      if ((ShowDemoWindowMisc()::filter == '\0') &&
         (iVar25 = __cxa_guard_acquire(&ShowDemoWindowMisc()::filter), iVar25 != 0)) {
        ImGuiTextFilter::ImGuiTextFilter((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,"");
        __cxa_atexit(ImGuiTextFilter::~ImGuiTextFilter,ShowDemoWindowMisc()::filter,&__dso_handle);
        __cxa_guard_release(&ShowDemoWindowMisc()::filter);
      }
      Text(
          "Filter usage:\n  \"\"         display all lines\n  \"xxx\"      display lines containing \"xxx\"\n  \"xxx,yyy\"  display lines containing \"xxx\" or \"yyy\"\n  \"-xxx\"     hide lines containing \"xxx\""
          );
      ImGuiTextFilter::Draw((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,"Filter (inc,-exc)",0.0)
      ;
      lVar27 = 0;
      do {
        _Var7 = ImGuiTextFilter::PassFilter
                          ((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,
                           *(char **)((long)&PTR_anon_var_dwarf_1883c9_002d5a70 + lVar27),
                           (char *)0x0);
        if (_Var7) {
          BulletText("%s");
        }
        lVar27 = lVar27 + 8;
      } while (lVar27 != 0x40);
    }
    bVar6 = CollapsingHeader("Inputs, Navigation & Focus",0);
    if (bVar6) {
      pIVar18 = GetIO();
      Text("WantCaptureMouse: %d",(ulong)pIVar18->WantCaptureMouse);
      Text("WantCaptureMouseUnlessPopupClose: %d",(ulong)pIVar18->WantCaptureMouseUnlessPopupClose);
      Text("WantCaptureKeyboard: %d",(ulong)pIVar18->WantCaptureKeyboard);
      Text("WantTextInput: %d",(ulong)pIVar18->WantTextInput);
      Text("WantSetMousePos: %d",(ulong)pIVar18->WantSetMousePos);
      Text("NavActive: %d, NavVisible: %d",(ulong)pIVar18->NavActive,(ulong)pIVar18->NavVisible);
      bVar6 = TreeNode("Mouse State");
      if (bVar6) {
        _Var7 = IsMousePosValid((ImVec2 *)0x0);
        if (_Var7) {
          Text("Mouse pos: (%g, %g)",SUB84((double)(pIVar18->MousePos).x,0),
               SUB84((double)(pIVar18->MousePos).y,0));
        }
        else {
          Text("Mouse pos: <INVALID>");
        }
        Text("Mouse delta: (%g, %g)",SUB84((double)(pIVar18->MouseDelta).x,0));
        lVar27 = 0;
        Text("Mouse down:");
        do {
          _Var7 = IsMouseDown((ImGuiMouseButton)lVar27);
          if (_Var7) {
            SameLine(0.0,-1.0);
            Text("b%d (%.02f secs)",SUB84((double)pIVar18->MouseDownDuration[lVar27],0));
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 != 5);
        Text("Mouse clicked:");
        iVar25 = 0;
        do {
          _Var7 = IsMouseClicked(iVar25,false);
          if (_Var7) {
            SameLine(0.0,-1.0);
            Text("b%d");
          }
          iVar25 = iVar25 + 1;
        } while (iVar25 != 5);
        Text("Mouse dblclick:");
        uVar12 = 0;
        do {
          _Var7 = IsMouseDoubleClicked(uVar12);
          if (_Var7) {
            SameLine(0.0,-1.0);
            Text("b%d",(ulong)uVar12);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != 5);
        Text("Mouse released:");
        uVar33 = 0;
        do {
          _Var7 = IsMouseReleased((int)uVar33);
          if (_Var7) {
            SameLine(0.0,-1.0);
            Text("b%d",uVar33);
          }
          uVar12 = (int)uVar33 + 1;
          uVar33 = (ulong)uVar12;
        } while (uVar12 != 5);
        Text("Mouse wheel: %.1f",SUB84((double)pIVar18->MouseWheel,0));
        Text("Pen Pressure: %.1f",SUB84((double)pIVar18->PenPressure,0));
        TreePop();
      }
      bVar6 = TreeNode("Keyboard & Navigation State");
      if (bVar6) {
        uVar33 = 0;
        Text("Keys down:");
        do {
          _Var7 = IsKeyDown((int)uVar33);
          if (_Var7) {
            SameLine(0.0,-1.0);
            Text("%d (0x%X) (%.02f secs)",SUB84((double)pIVar18->KeysDownDuration[uVar33],0),
                 uVar33 & 0xffffffff,uVar33 & 0xffffffff);
          }
          uVar33 = uVar33 + 1;
        } while (uVar33 != 0x200);
        Text("Keys pressed:");
        uVar12 = 0;
        do {
          _Var7 = IsKeyPressed(uVar12,true);
          if (_Var7) {
            SameLine(0.0,-1.0);
            Text("%d (0x%X)",(ulong)uVar12,(ulong)uVar12);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != 0x200);
        Text("Keys release:");
        uVar33 = 0;
        do {
          _Var7 = IsKeyReleased((int)uVar33);
          if (_Var7) {
            SameLine(0.0,-1.0);
            Text("%d (0x%X)",uVar33,uVar33);
          }
          uVar12 = (int)uVar33 + 1;
          uVar33 = (ulong)uVar12;
        } while (uVar12 != 0x200);
        pcVar30 = "CTRL ";
        if (pIVar18->KeyCtrl == false) {
          pcVar30 = "";
        }
        pcVar28 = "SHIFT ";
        if (pIVar18->KeyShift == false) {
          pcVar28 = "";
        }
        Text("Keys mods: %s%s%s%s",pcVar30,pcVar28);
        Text("Chars queue:");
        if (0 < (pIVar18->InputQueueCharacters).Size) {
          lVar27 = 0;
          do {
            uVar2 = (pIVar18->InputQueueCharacters).Data[lVar27];
            SameLine(0.0,-1.0);
            uVar12 = (int)(char)uVar2;
            if (0xde < (ushort)(uVar2 - 0x21)) {
              uVar12 = 0x3f;
            }
            Text("\'%c\' (0x%04X)",(ulong)uVar12,(ulong)uVar2);
            lVar27 = lVar27 + 1;
          } while (lVar27 < (pIVar18->InputQueueCharacters).Size);
        }
        uVar33 = 0;
        Text("NavInputs down:");
        do {
          if (0.0 < pIVar18->NavInputs[uVar33]) {
            SameLine(0.0,-1.0);
            Text("[%d] %.2f (%.02f secs)",SUB84((double)pIVar18->NavInputs[uVar33],0),
                 uVar33 & 0xffffffff);
          }
          uVar33 = uVar33 + 1;
        } while (uVar33 != 0x14);
        Text("NavInputs pressed:");
        uVar33 = 0;
        do {
          if ((pIVar18->NavInputsDownDuration[uVar33] == 0.0) &&
             (!NAN(pIVar18->NavInputsDownDuration[uVar33]))) {
            SameLine(0.0,-1.0);
            Text("[%d]",uVar33 & 0xffffffff);
          }
          uVar33 = uVar33 + 1;
        } while (uVar33 != 0x14);
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        Button("Hovering me sets the\nkeyboard capture flag",(ImVec2 *)local_e8);
        _Var7 = IsItemHovered(0);
        if (_Var7) {
          CaptureKeyboardFromApp(true);
        }
        SameLine(0.0,-1.0);
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        Button("Holding me clears the\nthe keyboard capture flag",(ImVec2 *)local_e8);
        _Var7 = IsItemActive();
        if (_Var7) {
          CaptureKeyboardFromApp(false);
        }
        TreePop();
      }
      bVar6 = TreeNode("Tabbing");
      if (bVar6) {
        Text("Use TAB/SHIFT+TAB to cycle through keyboard editable fields.");
        InputText("1",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        InputText("2",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        InputText("3",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        PushAllowKeyboardFocus(false);
        InputText("4 (tab skip)",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,
                  (void *)0x0);
        SameLine(0.0,-1.0);
        HelpMarker("Item won\'t be cycled through when using TAB or Shift+Tab.");
        PopAllowKeyboardFocus();
        InputText("5",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        TreePop();
      }
      bVar6 = TreeNode("Focus from code");
      if (bVar6) {
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar6 = Button("Focus on 1",(ImVec2 *)local_e8);
        SameLine(0.0,-1.0);
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar9 = Button("Focus on 2",(ImVec2 *)local_e8);
        SameLine(0.0,-1.0);
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar10 = Button("Focus on 3",(ImVec2 *)local_e8);
        if (bVar6) {
          SetKeyboardFocusHere(0);
        }
        InputText("1",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        _Var7 = IsItemActive();
        uVar12 = (uint)_Var7;
        if (bVar9) {
          SetKeyboardFocusHere(0);
        }
        InputText("2",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        _Var7 = IsItemActive();
        if (_Var7) {
          uVar12 = 2;
        }
        PushAllowKeyboardFocus(false);
        if (bVar10) {
          SetKeyboardFocusHere(0);
        }
        InputText("3 (tab skip)",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback)0x0,
                  (void *)0x0);
        _Var7 = IsItemActive();
        if (_Var7) {
          uVar12 = 3;
        }
        SameLine(0.0,-1.0);
        HelpMarker("Item won\'t be cycled through when using TAB or Shift+Tab.");
        PopAllowKeyboardFocus();
        if (uVar12 == 0) {
          Text("Item with focus: <none>");
        }
        else {
          Text("Item with focus: %d",(ulong)uVar12);
        }
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar6 = Button("Focus on X",(ImVec2 *)local_e8);
        SameLine(0.0,-1.0);
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar9 = Button("Focus on Y",(ImVec2 *)local_e8);
        iVar25 = 1;
        if (!bVar9) {
          iVar25 = bVar6 - 1;
        }
        SameLine(0.0,-1.0);
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar6 = Button("Focus on Z",(ImVec2 *)local_e8);
        iVar29 = 2;
        if (!bVar6) {
          iVar29 = iVar25;
        }
        if (iVar29 != -1) {
          SetKeyboardFocusHere(iVar29);
        }
        SliderFloat3("Float3",(float *)ShowDemoWindowMisc()::f3,0.0,1.0,"%.3f",0);
        TextWrapped("NB: Cursor & selection are preserved when refocusing last used item in code.");
        TreePop();
      }
      bVar6 = TreeNode("Dragging");
      if (bVar6) {
        TextWrapped(
                   "You can use ImGui::GetMouseDragDelta(0) to query for the dragged amount on any widget."
                   );
        uVar12 = 0;
        do {
          Text("IsMouseDragging(%d):",(ulong)uVar12);
          _Var7 = IsMouseDragging(uVar12,-1.0);
          Text("  w/ default threshold: %d,",(ulong)_Var7);
          _Var7 = IsMouseDragging(uVar12,0.0);
          Text("  w/ zero threshold: %d,",(ulong)_Var7);
          _Var7 = IsMouseDragging(uVar12,20.0);
          Text("  w/ large threshold: %d,",(ulong)_Var7);
          uVar12 = uVar12 + 1;
        } while (uVar12 != 3);
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        Button("Drag Me",(ImVec2 *)local_e8);
        _Var7 = IsItemActive();
        if (_Var7) {
          pIVar20 = GetForegroundDrawList();
          IVar13 = GetColorU32(0x15,1.0);
          ImDrawList::AddLine(pIVar20,pIVar18->MouseClickedPos,&pIVar18->MousePos,IVar13,4.0);
        }
        IVar4 = GetMouseDragDelta(0,0.0);
        local_118._8_4_ = extraout_XMM0_Dc_02;
        local_118._0_4_ = IVar4.x;
        local_118._4_4_ = IVar4.y;
        local_118._12_4_ = extraout_XMM0_Dd_02;
        IVar4 = GetMouseDragDelta(0,-1.0);
        uStack_40 = extraout_XMM0_Dc_03;
        local_48._0_4_ = IVar4.x;
        local_48._4_4_ = IVar4.y;
        uStack_3c = extraout_XMM0_Dd_03;
        fVar36 = (pIVar18->MouseDelta).x;
        local_138._0_8_ = (double)(pIVar18->MouseDelta).y;
        Text("GetMouseDragDelta(0):");
        Text("  w/ default threshold: (%.1f, %.1f)",SUB84((double)(float)local_48._0_4_,0),
             SUB84((double)(float)local_48._4_4_,0));
        Text("  w/ zero threshold: (%.1f, %.1f)",SUB84((double)(float)local_118._0_4_,0),
             SUB84((double)(float)local_118._4_4_,0));
        Text("io.MouseDelta: (%.1f, %.1f)",SUB84((double)fVar36,0),local_138._0_4_);
        TreePop();
      }
      bVar6 = TreeNode("Mouse cursors");
      if (bVar6) {
        IVar15 = GetMouseCursor();
        puVar31 = &DAT_002d5ab0;
        Text("Current mouse cursor = %d: %s",(long)IVar15,(&DAT_002d5ab0)[IVar15]);
        Text("Hover to see mouse cursors:");
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Your application can render a different mouse cursor based on what ImGui::GetMouseCursor() returns. If software cursor rendering (io.MouseDrawCursor) is set ImGui will draw the right cursor for you, otherwise your backend needs to handle it."
                  );
        uVar33 = 0;
        do {
          sprintf(local_e8,"Mouse cursor %d: %s",uVar33 & 0xffffffff,*puVar31);
          Bullet();
          local_158.x = 0.0;
          local_158.y = 0.0;
          Selectable(local_e8,false,0,&local_158);
          _Var7 = IsItemHovered(0);
          if (_Var7) {
            SetMouseCursor((ImGuiMouseCursor)uVar33);
          }
          uVar33 = uVar33 + 1;
          puVar31 = puVar31 + 1;
        } while (uVar33 != 9);
        TreePop();
      }
    }
    PopItemWidth();
  }
  End();
  return;
}

Assistant:

void ImGui::ShowDemoWindow(bool* p_open)
{
    // Exceptionally add an extra assert here for people confused about initial Dear ImGui setup
    // Most ImGui functions would normally just crash if the context is missing.
    IM_ASSERT(ImGui::GetCurrentContext() != NULL && "Missing dear imgui context. Refer to examples app!");

    // Examples Apps (accessible from the "Examples" menu)
    static bool show_app_main_menu_bar = false;
    static bool show_app_dockspace = false;
    static bool show_app_documents = false;

    static bool show_app_console = false;
    static bool show_app_log = false;
    static bool show_app_layout = false;
    static bool show_app_property_editor = false;
    static bool show_app_long_text = false;
    static bool show_app_auto_resize = false;
    static bool show_app_constrained_resize = false;
    static bool show_app_simple_overlay = false;
    static bool show_app_fullscreen = false;
    static bool show_app_window_titles = false;
    static bool show_app_custom_rendering = false;

    if (show_app_main_menu_bar)       ShowExampleAppMainMenuBar();
    if (show_app_dockspace)           ShowExampleAppDockSpace(&show_app_dockspace);     // Process the Docking app first, as explicit DockSpace() nodes needs to be submitted early (read comments near the DockSpace function)
    if (show_app_documents)           ShowExampleAppDocuments(&show_app_documents);     // Process the Document app next, as it may also use a DockSpace()

    if (show_app_console)             ShowExampleAppConsole(&show_app_console);
    if (show_app_log)                 ShowExampleAppLog(&show_app_log);
    if (show_app_layout)              ShowExampleAppLayout(&show_app_layout);
    if (show_app_property_editor)     ShowExampleAppPropertyEditor(&show_app_property_editor);
    if (show_app_long_text)           ShowExampleAppLongText(&show_app_long_text);
    if (show_app_auto_resize)         ShowExampleAppAutoResize(&show_app_auto_resize);
    if (show_app_constrained_resize)  ShowExampleAppConstrainedResize(&show_app_constrained_resize);
    if (show_app_simple_overlay)      ShowExampleAppSimpleOverlay(&show_app_simple_overlay);
    if (show_app_fullscreen)          ShowExampleAppFullscreen(&show_app_fullscreen);
    if (show_app_window_titles)       ShowExampleAppWindowTitles(&show_app_window_titles);
    if (show_app_custom_rendering)    ShowExampleAppCustomRendering(&show_app_custom_rendering);

    // Dear ImGui Apps (accessible from the "Tools" menu)
    static bool show_app_metrics = false;
    static bool show_app_stack_tool = false;
    static bool show_app_style_editor = false;
    static bool show_app_about = false;

    if (show_app_metrics)       { ImGui::ShowMetricsWindow(&show_app_metrics); }
    if (show_app_stack_tool)    { ImGui::ShowStackToolWindow(&show_app_stack_tool); }
    if (show_app_about)         { ImGui::ShowAboutWindow(&show_app_about); }
    if (show_app_style_editor)
    {
        ImGui::Begin("Dear ImGui Style Editor", &show_app_style_editor);
        ImGui::ShowStyleEditor();
        ImGui::End();
    }

    // Demonstrate the various window flags. Typically you would just use the default!
    static bool no_titlebar = false;
    static bool no_scrollbar = false;
    static bool no_menu = false;
    static bool no_move = false;
    static bool no_resize = false;
    static bool no_collapse = false;
    static bool no_close = false;
    static bool no_nav = false;
    static bool no_background = false;
    static bool no_bring_to_front = false;
    static bool no_docking = false;
    static bool unsaved_document = false;

    ImGuiWindowFlags window_flags = 0;
    if (no_titlebar)        window_flags |= ImGuiWindowFlags_NoTitleBar;
    if (no_scrollbar)       window_flags |= ImGuiWindowFlags_NoScrollbar;
    if (!no_menu)           window_flags |= ImGuiWindowFlags_MenuBar;
    if (no_move)            window_flags |= ImGuiWindowFlags_NoMove;
    if (no_resize)          window_flags |= ImGuiWindowFlags_NoResize;
    if (no_collapse)        window_flags |= ImGuiWindowFlags_NoCollapse;
    if (no_nav)             window_flags |= ImGuiWindowFlags_NoNav;
    if (no_background)      window_flags |= ImGuiWindowFlags_NoBackground;
    if (no_bring_to_front)  window_flags |= ImGuiWindowFlags_NoBringToFrontOnFocus;
    if (no_docking)         window_flags |= ImGuiWindowFlags_NoDocking;
    if (unsaved_document)   window_flags |= ImGuiWindowFlags_UnsavedDocument;
    if (no_close)           p_open = NULL; // Don't pass our bool* to Begin

    // We specify a default position/size in case there's no data in the .ini file.
    // We only do it to make the demo applications a little more welcoming, but typically this isn't required.
    const ImGuiViewport* main_viewport = ImGui::GetMainViewport();
    ImGui::SetNextWindowPos(ImVec2(main_viewport->WorkPos.x + 650, main_viewport->WorkPos.y + 20), ImGuiCond_FirstUseEver);
    ImGui::SetNextWindowSize(ImVec2(550, 680), ImGuiCond_FirstUseEver);

    // Main body of the Demo window starts here.
    if (!ImGui::Begin("Dear ImGui Demo", p_open, window_flags))
    {
        // Early out if the window is collapsed, as an optimization.
        ImGui::End();
        return;
    }

    // Most "big" widgets share a common width settings by default. See 'Demo->Layout->Widgets Width' for details.

    // e.g. Use 2/3 of the space for widgets and 1/3 for labels (right align)
    //ImGui::PushItemWidth(-ImGui::GetWindowWidth() * 0.35f);

    // e.g. Leave a fixed amount of width for labels (by passing a negative value), the rest goes to widgets.
    ImGui::PushItemWidth(ImGui::GetFontSize() * -12);

    // Menu Bar
    if (ImGui::BeginMenuBar())
    {
        if (ImGui::BeginMenu("Menu"))
        {
            ShowExampleMenuFile();
            ImGui::EndMenu();
        }
        if (ImGui::BeginMenu("Examples"))
        {
            ImGui::MenuItem("Main menu bar", NULL, &show_app_main_menu_bar);
            ImGui::MenuItem("Console", NULL, &show_app_console);
            ImGui::MenuItem("Log", NULL, &show_app_log);
            ImGui::MenuItem("Simple layout", NULL, &show_app_layout);
            ImGui::MenuItem("Property editor", NULL, &show_app_property_editor);
            ImGui::MenuItem("Long text display", NULL, &show_app_long_text);
            ImGui::MenuItem("Auto-resizing window", NULL, &show_app_auto_resize);
            ImGui::MenuItem("Constrained-resizing window", NULL, &show_app_constrained_resize);
            ImGui::MenuItem("Simple overlay", NULL, &show_app_simple_overlay);
            ImGui::MenuItem("Fullscreen window", NULL, &show_app_fullscreen);
            ImGui::MenuItem("Manipulating window titles", NULL, &show_app_window_titles);
            ImGui::MenuItem("Custom rendering", NULL, &show_app_custom_rendering);
            ImGui::MenuItem("Dockspace", NULL, &show_app_dockspace);
            ImGui::MenuItem("Documents", NULL, &show_app_documents);
            ImGui::EndMenu();
        }
        //if (ImGui::MenuItem("MenuItem")) {} // You can also use MenuItem() inside a menu bar!
        if (ImGui::BeginMenu("Tools"))
        {
#ifndef IMGUI_DISABLE_METRICS_WINDOW
            ImGui::MenuItem("Metrics/Debugger", NULL, &show_app_metrics);
            ImGui::MenuItem("Stack Tool", NULL, &show_app_stack_tool);
#endif
            ImGui::MenuItem("Style Editor", NULL, &show_app_style_editor);
            ImGui::MenuItem("About Dear ImGui", NULL, &show_app_about);
            ImGui::EndMenu();
        }
        ImGui::EndMenuBar();
    }

    ImGui::Text("dear imgui says hello. (%s)", IMGUI_VERSION);
    ImGui::Spacing();

    if (ImGui::CollapsingHeader("Help"))
    {
        ImGui::Text("ABOUT THIS DEMO:");
        ImGui::BulletText("Sections below are demonstrating many aspects of the library.");
        ImGui::BulletText("The \"Examples\" menu above leads to more demo contents.");
        ImGui::BulletText("The \"Tools\" menu above gives access to: About Box, Style Editor,\n"
                          "and Metrics/Debugger (general purpose Dear ImGui debugging tool).");
        ImGui::Separator();

        ImGui::Text("PROGRAMMER GUIDE:");
        ImGui::BulletText("See the ShowDemoWindow() code in imgui_demo.cpp. <- you are here!");
        ImGui::BulletText("See comments in imgui.cpp.");
        ImGui::BulletText("See example applications in the examples/ folder.");
        ImGui::BulletText("Read the FAQ at http://www.dearimgui.org/faq/");
        ImGui::BulletText("Set 'io.ConfigFlags |= NavEnableKeyboard' for keyboard controls.");
        ImGui::BulletText("Set 'io.ConfigFlags |= NavEnableGamepad' for gamepad controls.");
        ImGui::Separator();

        ImGui::Text("USER GUIDE:");
        ImGui::ShowUserGuide();
    }

    if (ImGui::CollapsingHeader("Configuration"))
    {
        ImGuiIO& io = ImGui::GetIO();

        if (ImGui::TreeNode("Configuration##2"))
        {
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableKeyboard",    &io.ConfigFlags, ImGuiConfigFlags_NavEnableKeyboard);
            ImGui::SameLine(); HelpMarker("Enable keyboard controls.");
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableGamepad",     &io.ConfigFlags, ImGuiConfigFlags_NavEnableGamepad);
            ImGui::SameLine(); HelpMarker("Enable gamepad controls. Require backend to set io.BackendFlags |= ImGuiBackendFlags_HasGamepad.\n\nRead instructions in imgui.cpp for details.");
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableSetMousePos", &io.ConfigFlags, ImGuiConfigFlags_NavEnableSetMousePos);
            ImGui::SameLine(); HelpMarker("Instruct navigation to move the mouse cursor. See comment for ImGuiConfigFlags_NavEnableSetMousePos.");
            ImGui::CheckboxFlags("io.ConfigFlags: NoMouse",              &io.ConfigFlags, ImGuiConfigFlags_NoMouse);
            if (io.ConfigFlags & ImGuiConfigFlags_NoMouse)
            {
                // The "NoMouse" option can get us stuck with a disabled mouse! Let's provide an alternative way to fix it:
                if (fmodf((float)ImGui::GetTime(), 0.40f) < 0.20f)
                {
                    ImGui::SameLine();
                    ImGui::Text("<<PRESS SPACE TO DISABLE>>");
                }
                if (ImGui::IsKeyPressed(ImGui::GetKeyIndex(ImGuiKey_Space)))
                    io.ConfigFlags &= ~ImGuiConfigFlags_NoMouse;
            }
            ImGui::CheckboxFlags("io.ConfigFlags: NoMouseCursorChange", &io.ConfigFlags, ImGuiConfigFlags_NoMouseCursorChange);
            ImGui::SameLine(); HelpMarker("Instruct backend to not alter mouse cursor shape and visibility.");

            ImGui::CheckboxFlags("io.ConfigFlags: DockingEnable", &io.ConfigFlags, ImGuiConfigFlags_DockingEnable);
            ImGui::SameLine();
            if (io.ConfigDockingWithShift)
                HelpMarker("Drag from window title bar or their tab to dock/undock. Hold SHIFT to enable docking.\n\nDrag from window menu button (upper-left button) to undock an entire node (all windows).");
            else
                HelpMarker("Drag from window title bar or their tab to dock/undock. Hold SHIFT to disable docking.\n\nDrag from window menu button (upper-left button) to undock an entire node (all windows).");
            if (io.ConfigFlags & ImGuiConfigFlags_DockingEnable)
            {
                ImGui::Indent();
                ImGui::Checkbox("io.ConfigDockingNoSplit", &io.ConfigDockingNoSplit);
                ImGui::SameLine(); HelpMarker("Simplified docking mode: disable window splitting, so docking is limited to merging multiple windows together into tab-bars.");
                ImGui::Checkbox("io.ConfigDockingWithShift", &io.ConfigDockingWithShift);
                ImGui::SameLine(); HelpMarker("Enable docking when holding Shift only (allow to drop in wider space, reduce visual noise)");
                ImGui::Checkbox("io.ConfigDockingAlwaysTabBar", &io.ConfigDockingAlwaysTabBar);
                ImGui::SameLine(); HelpMarker("Create a docking node and tab-bar on single floating windows.");
                ImGui::Checkbox("io.ConfigDockingTransparentPayload", &io.ConfigDockingTransparentPayload);
                ImGui::SameLine(); HelpMarker("Make window or viewport transparent when docking and only display docking boxes on the target viewport. Useful if rendering of multiple viewport cannot be synced. Best used with ConfigViewportsNoAutoMerge.");
                ImGui::Unindent();
            }

            ImGui::CheckboxFlags("io.ConfigFlags: ViewportsEnable", &io.ConfigFlags, ImGuiConfigFlags_ViewportsEnable);
            ImGui::SameLine(); HelpMarker("[beta] Enable beta multi-viewports support. See ImGuiPlatformIO for details.");
            if (io.ConfigFlags & ImGuiConfigFlags_ViewportsEnable)
            {
                ImGui::Indent();
                ImGui::Checkbox("io.ConfigViewportsNoAutoMerge", &io.ConfigViewportsNoAutoMerge);
                ImGui::SameLine(); HelpMarker("Set to make all floating imgui windows always create their own viewport. Otherwise, they are merged into the main host viewports when overlapping it.");
                ImGui::Checkbox("io.ConfigViewportsNoTaskBarIcon", &io.ConfigViewportsNoTaskBarIcon);
                ImGui::SameLine(); HelpMarker("Toggling this at runtime is normally unsupported (most platform backends won't refresh the task bar icon state right away).");
                ImGui::Checkbox("io.ConfigViewportsNoDecoration", &io.ConfigViewportsNoDecoration);
                ImGui::SameLine(); HelpMarker("Toggling this at runtime is normally unsupported (most platform backends won't refresh the decoration right away).");
                ImGui::Checkbox("io.ConfigViewportsNoDefaultParent", &io.ConfigViewportsNoDefaultParent);
                ImGui::SameLine(); HelpMarker("Toggling this at runtime is normally unsupported (most platform backends won't refresh the parenting right away).");
                ImGui::Unindent();
            }

            ImGui::Checkbox("io.ConfigInputTextCursorBlink", &io.ConfigInputTextCursorBlink);
            ImGui::SameLine(); HelpMarker("Enable blinking cursor (optional as some users consider it to be distracting)");
            ImGui::Checkbox("io.ConfigDragClickToInputText", &io.ConfigDragClickToInputText);
            ImGui::SameLine(); HelpMarker("Enable turning DragXXX widgets into text input with a simple mouse click-release (without moving).");
            ImGui::Checkbox("io.ConfigWindowsResizeFromEdges", &io.ConfigWindowsResizeFromEdges);
            ImGui::SameLine(); HelpMarker("Enable resizing of windows from their edges and from the lower-left corner.\nThis requires (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors) because it needs mouse cursor feedback.");
            ImGui::Checkbox("io.ConfigWindowsMoveFromTitleBarOnly", &io.ConfigWindowsMoveFromTitleBarOnly);
            ImGui::Checkbox("io.MouseDrawCursor", &io.MouseDrawCursor);
            ImGui::SameLine(); HelpMarker("Instruct Dear ImGui to render a mouse cursor itself. Note that a mouse cursor rendered via your application GPU rendering path will feel more laggy than hardware cursor, but will be more in sync with your other visuals.\n\nSome desktop applications may use both kinds of cursors (e.g. enable software cursor only when resizing/dragging something).");
            ImGui::Text("Also see Style->Rendering for rendering options.");
            ImGui::TreePop();
            ImGui::Separator();
        }

        if (ImGui::TreeNode("Backend Flags"))
        {
            HelpMarker(
                "Those flags are set by the backends (imgui_impl_xxx files) to specify their capabilities.\n"
                "Here we expose them as read-only fields to avoid breaking interactions with your backend.");

            // Make a local copy to avoid modifying actual backend flags.
            ImGuiBackendFlags backend_flags = io.BackendFlags;
            ImGui::CheckboxFlags("io.BackendFlags: HasGamepad",             &backend_flags, ImGuiBackendFlags_HasGamepad);
            ImGui::CheckboxFlags("io.BackendFlags: HasMouseCursors",        &backend_flags, ImGuiBackendFlags_HasMouseCursors);
            ImGui::CheckboxFlags("io.BackendFlags: HasSetMousePos",         &backend_flags, ImGuiBackendFlags_HasSetMousePos);
            ImGui::CheckboxFlags("io.BackendFlags: PlatformHasViewports",   &backend_flags, ImGuiBackendFlags_PlatformHasViewports);
            ImGui::CheckboxFlags("io.BackendFlags: HasMouseHoveredViewport",&backend_flags, ImGuiBackendFlags_HasMouseHoveredViewport);
            ImGui::CheckboxFlags("io.BackendFlags: RendererHasVtxOffset",   &backend_flags, ImGuiBackendFlags_RendererHasVtxOffset);
            ImGui::CheckboxFlags("io.BackendFlags: RendererHasViewports",   &backend_flags, ImGuiBackendFlags_RendererHasViewports);
            ImGui::TreePop();
            ImGui::Separator();
        }

        if (ImGui::TreeNode("Style"))
        {
            HelpMarker("The same contents can be accessed in 'Tools->Style Editor' or by calling the ShowStyleEditor() function.");
            ImGui::ShowStyleEditor();
            ImGui::TreePop();
            ImGui::Separator();
        }

        if (ImGui::TreeNode("Capture/Logging"))
        {
            HelpMarker(
                "The logging API redirects all text output so you can easily capture the content of "
                "a window or a block. Tree nodes can be automatically expanded.\n"
                "Try opening any of the contents below in this window and then click one of the \"Log To\" button.");
            ImGui::LogButtons();

            HelpMarker("You can also call ImGui::LogText() to output directly to the log without a visual output.");
            if (ImGui::Button("Copy \"Hello, world!\" to clipboard"))
            {
                ImGui::LogToClipboard();
                ImGui::LogText("Hello, world!");
                ImGui::LogFinish();
            }
            ImGui::TreePop();
        }
    }

    if (ImGui::CollapsingHeader("Window options"))
    {
        if (ImGui::BeginTable("split", 3))
        {
            ImGui::TableNextColumn(); ImGui::Checkbox("No titlebar", &no_titlebar);
            ImGui::TableNextColumn(); ImGui::Checkbox("No scrollbar", &no_scrollbar);
            ImGui::TableNextColumn(); ImGui::Checkbox("No menu", &no_menu);
            ImGui::TableNextColumn(); ImGui::Checkbox("No move", &no_move);
            ImGui::TableNextColumn(); ImGui::Checkbox("No resize", &no_resize);
            ImGui::TableNextColumn(); ImGui::Checkbox("No collapse", &no_collapse);
            ImGui::TableNextColumn(); ImGui::Checkbox("No close", &no_close);
            ImGui::TableNextColumn(); ImGui::Checkbox("No nav", &no_nav);
            ImGui::TableNextColumn(); ImGui::Checkbox("No background", &no_background);
            ImGui::TableNextColumn(); ImGui::Checkbox("No bring to front", &no_bring_to_front);
            ImGui::TableNextColumn(); ImGui::Checkbox("No docking", &no_docking);
            ImGui::TableNextColumn(); ImGui::Checkbox("Unsaved document", &unsaved_document);
            ImGui::EndTable();
        }
    }

    // All demo contents
    ShowDemoWindowWidgets();
    ShowDemoWindowLayout();
    ShowDemoWindowPopups();
    ShowDemoWindowTables();
    ShowDemoWindowMisc();

    // End of ShowDemoWindow()
    ImGui::PopItemWidth();
    ImGui::End();
}